

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O3

bool tinyusdz::prim::ReconstructPrim<tinyusdz::GeomMesh>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,GeomMesh *mesh,
               string *warn,string *err,PrimReconstructOptions *options)

{
  _Base_ptr __v;
  uint *puVar1;
  mapped_type mVar2;
  code *pcVar3;
  TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
  *pTVar4;
  bool bVar5;
  __type _Var6;
  int iVar7;
  ostream *poVar8;
  undefined8 *puVar9;
  const_iterator cVar10;
  mapped_type *this;
  _Base_ptr p_Var11;
  mapped_type *pmVar12;
  uint uVar13;
  uint *prop_name;
  GeomMesh *pGVar14;
  char *pcVar15;
  undefined **in;
  char *pcVar16;
  undefined8 this_00;
  Property *pPVar17;
  bool bVar18;
  Attribute *attr;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  size_type __dnew;
  ostringstream ss_e;
  undefined8 in_stack_fffffffffffff8e8;
  TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
  *pTVar19;
  undefined1 local_708 [32];
  TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
  *local_6e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6e0;
  GeomMesh *local_6c0;
  string *local_6b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_6b0;
  undefined1 local_698 [8];
  undefined1 local_690 [32];
  double local_670;
  undefined1 local_668 [16];
  undefined1 local_658 [96];
  ios_base local_5f8 [304];
  undefined1 local_4c8 [192];
  storage_t<tinyusdz::value::StringData> local_408;
  undefined8 local_3d8;
  storage_t<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
  sStack_3d0;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 local_390;
  storage_t<tinyusdz::Token> sStack_388;
  undefined8 local_368;
  storage_t<tinyusdz::Token> sStack_360;
  undefined8 local_340;
  storage_t<tinyusdz::Token> sStack_338;
  undefined8 local_318;
  storage_t<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
  sStack_310;
  undefined8 local_2e0;
  undefined1 auStack_2d8 [40];
  undefined1 auStack_2b0 [40];
  storage_t<tinyusdz::Token> local_288 [3];
  undefined8 local_228;
  undefined8 local_220;
  _Any_data local_218;
  undefined8 local_208;
  undefined1 auStack_200 [8];
  undefined1 local_1f8 [32];
  _Any_data local_1d8;
  undefined8 local_1c8;
  undefined1 auStack_1c0 [8];
  EnumHandlerFun<tinyusdz::GeomSubset::FamilyType> local_1b8;
  string local_190 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180;
  string local_170 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_160;
  string local_150 [16];
  undefined1 local_140 [16];
  string local_130 [16];
  undefined1 local_120 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110;
  undefined1 local_100 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  undefined8 local_e0 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  undefined8 local_c0 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  undefined8 local_a0 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  undefined1 local_80 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  undefined8 local_60 [2];
  string local_50 [16];
  undefined8 local_40 [2];
  
  local_690._16_8_ = local_690;
  local_690._0_4_ = _S_red;
  bVar18 = false;
  local_690._8_8_ = (pointer)0x0;
  local_670 = 0.0;
  pTVar19 = (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
             *)CONCAT44((int)((ulong)in_stack_fffffffffffff8e8 >> 0x20),
                        (uint)options->strict_allowedToken_check);
  prop_name = (uint *)mesh;
  local_690._24_8_ = local_690._16_8_;
  bVar5 = anon_unknown_0::ReconstructGPrimProperties
                    (spec,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_698,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                      *)properties,&mesh->super_GPrim,warn,err,options->strict_allowedToken_check);
  if (bVar5) {
    p_Var11 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    local_220 = &(properties->_M_t)._M_impl.super__Rb_tree_header;
    bVar18 = true;
    if (p_Var11 != (_Base_ptr)local_220) {
      local_5f8._296_8_ = &mesh->skeleton;
      local_228 = &mesh->points;
      local_288[2]._24_8_ = &mesh->normals;
      local_288[2]._16_8_ = &mesh->faceVertexCounts;
      local_288[2]._0_8_ = &mesh->faceVertexIndices;
      local_288[1]._24_8_ = &mesh->cornerIndices;
      local_288[1]._16_8_ = &mesh->cornerSharpnesses;
      local_288[1]._8_8_ = &mesh->creaseIndices;
      local_288[1]._0_8_ = &mesh->creaseLengths;
      local_288[0]._24_8_ = &mesh->creaseSharpnesses;
      local_288[0]._16_8_ = &mesh->holeIndices;
      local_288[0]._8_8_ = &mesh->blendShapes;
      auStack_2b0._32_8_ = &mesh->subsetFamilyTypeMap;
      local_288[0]._0_8_ = &(mesh->super_GPrim).props;
      local_5f8._272_8_ = &mesh->faceVaryingLinearInterpolation;
      local_5f8._280_8_ = &mesh->interpolateBoundary;
      local_5f8._288_8_ = &mesh->subdivisionScheme;
      local_288[2]._8_8_ = &mesh->blendShapeTargets;
      puVar1 = (uint *)(local_4c8 + 0x10);
      local_6e8 = (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
                   *)err;
      local_6b8 = warn;
      do {
        __v = p_Var11 + 1;
        iVar7 = ::std::__cxx11::string::compare((char *)__v);
        if (iVar7 == 0) {
          local_4c8[0x18] = 'l';
          local_4c8._25_2_ = 0x7465;
          local_4c8[0x1b] = 'o';
          local_4c8[0x1c] = 'n';
          local_4c8._16_2_ = 0x6b73;
          local_4c8[0x12] = 'e';
          local_4c8[0x13] = 'l';
          local_4c8[0x14] = ':';
          local_4c8[0x15] = 's';
          local_4c8[0x16] = 'k';
          local_4c8[0x17] = 'e';
          local_4c8._8_8_ = (GeomMesh *)0xd;
          local_4c8[0x1d] = '\0';
          local_4c8._0_8_ = puVar1;
          cVar10 = ::std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_698,(key_type *)local_4c8);
          if ((uint *)local_4c8._0_8_ != puVar1) {
            operator_delete((void *)local_4c8._0_8_,
                            CONCAT17(local_4c8[0x17],
                                     CONCAT16(local_4c8[0x16],
                                              CONCAT15(local_4c8[0x15],
                                                       CONCAT14(local_4c8[0x14],
                                                                CONCAT13(local_4c8[0x13],
                                                                         CONCAT12(local_4c8[0x12],
                                                                                  local_4c8._16_2_))
                                                               )))) + 1);
          }
          if (cVar10._M_node != (_Base_ptr)local_690) goto LAB_00227116;
          if (((ulong)p_Var11[0x17]._M_parent & 0xfffffffe00000000) == 0x200000000) {
            if (*(uint *)&p_Var11[0x17]._M_left < 4) {
              prop_name = &switchD_00223ecf::switchdataD_003da7b0;
              switch(*(uint *)&p_Var11[0x17]._M_left) {
              default:
                nonstd::optional_lite::optional<tinyusdz::Relationship>::operator=
                          ((optional<tinyusdz::Relationship> *)local_5f8._296_8_,
                           (Relationship *)&p_Var11[0x17]._M_left);
                ::std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string_const&>
                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)local_698,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__v)
                ;
                goto LAB_00223b59;
              case 1:
                goto switchD_00223ecf_caseD_1;
              case 2:
                if ((long)p_Var11[0x1e]._M_left - (long)p_Var11[0x1e]._M_parent != 0xd0) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4c8);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_4c8,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_4c8,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                             ,0x5a);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_4c8,"ReconstructPrim",0xf);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,"():",3)
                  ;
                  poVar8 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4c8,0xe65);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
                  pcVar16 = "`{}` target is empty or has mutiple Paths. Must be single Path.";
                  pcVar15 = "";
                  goto LAB_00227a6c;
                }
switchD_00223ecf_caseD_1:
                this_00 = local_5f8._296_8_;
              }
              goto LAB_00223fec;
            }
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4c8);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_4c8,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_4c8,"ReconstructPrim",0xf);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,"():",3);
            poVar8 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4c8,0xe65);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
            pcVar16 = "Internal error. Property `{}` is not a valid Relationship.";
            pcVar15 = "";
LAB_00227a6c:
            local_708._0_8_ = local_708 + 0x10;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)local_708,pcVar16,pcVar15);
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4c8);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_4c8,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_4c8,"ReconstructPrim",0xf);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,"():",3);
            poVar8 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4c8,0xe65);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
            local_708._0_8_ = local_708 + 0x10;
            local_668._0_8_ = (GeomMesh *)0x25;
            local_708._0_8_ = ::std::__cxx11::string::_M_create((ulong *)local_708,(ulong)local_668)
            ;
            local_708._16_8_ = local_668._0_8_;
            (((GeomMesh *)local_708._0_8_)->super_GPrim).super_Xformable.xformOps.
            super__Vector_base<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x79747265706f7250;
            (((GeomMesh *)local_708._0_8_)->super_GPrim).super_Xformable.xformOps.
            super__Vector_base<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x756d20607d7b6020;
            (((GeomMesh *)local_708._0_8_)->super_GPrim).super_Xformable.xformOps.
            super__Vector_base<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x2061206562207473;
            (((GeomMesh *)local_708._0_8_)->super_GPrim).super_Xformable._dirty = true;
            (((GeomMesh *)local_708._0_8_)->super_GPrim).super_Xformable.field_0x19 = 'e';
            (((GeomMesh *)local_708._0_8_)->super_GPrim).super_Xformable.field_0x1a = 'l';
            (((GeomMesh *)local_708._0_8_)->super_GPrim).super_Xformable.field_0x1b = 'a';
            (((GeomMesh *)local_708._0_8_)->super_GPrim).super_Xformable.field_0x1c = 't';
            (((GeomMesh *)local_708._0_8_)->super_GPrim).super_Xformable.field_0x1d = 'i';
            (((GeomMesh *)local_708._0_8_)->super_GPrim).super_Xformable.field_0x1e = 'o';
            (((GeomMesh *)local_708._0_8_)->super_GPrim).super_Xformable.field_0x1f = 'n';
            *(undefined8 *)&(((GeomMesh *)local_708._0_8_)->super_GPrim).super_Xformable.field_0x1d
                 = 0x2e706968736e6f69;
            local_708._8_8_ = local_668._0_8_;
            *(char *)(local_668._0_8_ + (long)&((GeomMesh *)local_708._0_8_)->super_GPrim) = '\0';
            prop_name = (uint *)local_668._0_8_;
          }
          in = &kSkelSkeleton;
LAB_00227a7b:
          fmt::format<char_const*>
                    ((string *)local_668,(fmt *)local_708,(string *)in,(char **)prop_name);
          poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_4c8,(char *)local_668._0_8_,local_668._8_8_);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
          if ((GeomMesh *)local_668._0_8_ != (GeomMesh *)local_658) {
            operator_delete((void *)local_668._0_8_,(ulong)(local_658._0_8_ + 1));
          }
          pTVar19 = local_6e8;
          if ((GeomMesh *)local_708._0_8_ != (GeomMesh *)(local_708 + 0x10)) {
            operator_delete((void *)local_708._0_8_,(ulong)(local_708._16_8_ + 1));
          }
          if (pTVar19 !=
              (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
               *)0x0) {
            ::std::__cxx11::stringbuf::str();
            puVar9 = (undefined8 *)
                     ::std::__cxx11::string::_M_append
                               (local_708,(ulong)(pTVar19->_metas).interpolation);
            pGVar14 = (GeomMesh *)(puVar9 + 2);
            if ((GeomMesh *)*puVar9 == pGVar14) {
              local_658._0_8_ =
                   (pGVar14->super_GPrim).super_Xformable.xformOps.
                   super__Vector_base<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>._M_impl
                   .super__Vector_impl_data._M_start;
              local_658._8_8_ = puVar9[3];
              local_668._0_8_ = (GeomMesh *)local_658;
            }
            else {
              local_658._0_8_ =
                   (pGVar14->super_GPrim).super_Xformable.xformOps.
                   super__Vector_base<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>._M_impl
                   .super__Vector_impl_data._M_start;
              local_668._0_8_ = (GeomMesh *)*puVar9;
            }
            local_668._8_8_ = puVar9[1];
            *puVar9 = pGVar14;
            puVar9[1] = 0;
            *(undefined1 *)(puVar9 + 2) = 0;
            ::std::__cxx11::string::operator=((string *)pTVar19,(string *)local_668);
            if ((GeomMesh *)local_668._0_8_ != (GeomMesh *)local_658) {
              operator_delete((void *)local_668._0_8_,(ulong)(local_658._0_8_ + 1));
            }
            if ((GeomMesh *)local_708._0_8_ != (GeomMesh *)(local_708 + 0x10)) {
              operator_delete((void *)local_708._0_8_,(ulong)(local_708._16_8_ + 1));
            }
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4c8);
          ::std::ios_base::~ios_base((ios_base *)(local_4c8 + 0x70));
LAB_00227bd1:
          bVar18 = false;
          goto LAB_00227bd4;
        }
LAB_00223b59:
        iVar7 = ::std::__cxx11::string::compare((char *)__v);
        if (iVar7 == 0) {
          local_668._0_8_ = (GeomMesh *)0x16;
          local_4c8._0_8_ = puVar1;
          local_4c8._0_8_ = ::std::__cxx11::string::_M_create((ulong *)local_4c8,(ulong)local_668);
          local_4c8._16_2_ = (undefined2)local_668._0_8_;
          local_4c8[0x12] = SUB81(local_668._0_8_,2);
          local_4c8[0x13] = SUB81(local_668._0_8_,3);
          local_4c8[0x14] = SUB81(local_668._0_8_,4);
          local_4c8[0x15] = SUB81(local_668._0_8_,5);
          local_4c8[0x16] = SUB81(local_668._0_8_,6);
          local_4c8[0x17] = SUB81(local_668._0_8_,7);
          *(undefined8 *)local_4c8._0_8_ = 0x656c623a6c656b73;
          *(undefined8 *)(local_4c8._0_8_ + 8) = 0x546570616853646e;
          builtin_strncpy((char *)(local_4c8._0_8_ + 0xe),"eTargets",8);
          local_4c8._8_8_ = local_668._0_8_;
          *(char *)(local_4c8._0_8_ + local_668._0_8_) = '\0';
          prop_name = (uint *)local_668._0_8_;
          cVar10 = ::std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_698,(key_type *)local_4c8);
          if ((uint *)local_4c8._0_8_ != puVar1) {
            operator_delete((void *)local_4c8._0_8_,
                            CONCAT17(local_4c8[0x17],
                                     CONCAT16(local_4c8[0x16],
                                              CONCAT15(local_4c8[0x15],
                                                       CONCAT14(local_4c8[0x14],
                                                                CONCAT13(local_4c8[0x13],
                                                                         CONCAT12(local_4c8[0x12],
                                                                                  local_4c8._16_2_))
                                                               )))) + 1);
          }
          if (cVar10._M_node != (_Base_ptr)local_690) goto LAB_00227116;
          this_00 = local_288[2]._8_8_;
          if (((ulong)p_Var11[0x17]._M_parent & 0xfffffffe00000000) != 0x200000000) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4c8);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_4c8,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_4c8,"ReconstructPrim",0xf);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,"():",3);
            poVar8 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4c8,0xe66);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
            local_708._0_8_ = local_708 + 0x10;
            local_668._0_8_ = (GeomMesh *)0x1b;
            local_708._0_8_ = ::std::__cxx11::string::_M_create((ulong *)local_708,(ulong)local_668)
            ;
            local_708._16_8_ = local_668._0_8_;
            builtin_strncpy((char *)((long)&(((GeomMesh *)local_708._0_8_)->super_GPrim).
                                            super_Xformable.xformOps.
                                            super__Vector_base<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>
                                            ._M_impl.super__Vector_impl_data._M_finish + 3),
                            "e a Rela",8);
            builtin_strncpy((char *)((long)&(((GeomMesh *)local_708._0_8_)->super_GPrim).
                                            super_Xformable.xformOps.
                                            super__Vector_base<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 3),
                            "tionship",8);
            (((GeomMesh *)local_708._0_8_)->super_GPrim).super_Xformable.xformOps.
            super__Vector_base<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x73756d20607d7b60;
            (((GeomMesh *)local_708._0_8_)->super_GPrim).super_Xformable.xformOps.
            super__Vector_base<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x5220612065622074;
            local_708._8_8_ = local_668._0_8_;
            *(char *)(local_668._0_8_ + (long)&((GeomMesh *)local_708._0_8_)->super_GPrim) = '\0';
            in = &kSkelBlendShapeTargets;
            prop_name = (uint *)local_668._0_8_;
            goto LAB_00227a7b;
          }
LAB_00223fec:
          nonstd::optional_lite::optional<tinyusdz::Relationship>::operator=
                    ((optional<tinyusdz::Relationship> *)this_00,
                     (Relationship *)&p_Var11[0x17]._M_left);
          ::std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)local_698,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__v);
          goto LAB_00227116;
        }
        local_50._0_8_ = local_40;
        ::std::__cxx11::string::_M_construct<char*>
                  (local_50,*(long *)(p_Var11 + 1),
                   (long)&(p_Var11[1]._M_parent)->_M_color + *(long *)(p_Var11 + 1));
        prop_name = &p_Var11[2]._M_color;
        local_4c8[0x14] = 't';
        local_4c8[0x15] = 's';
        local_4c8._16_2_ = 0x6f70;
        local_4c8[0x12] = 'i';
        local_4c8[0x13] = 'n';
        local_4c8._8_8_ = (GeomMesh *)0x6;
        local_4c8[0x16] = '\0';
        pPVar17 = (Property *)local_4c8;
        local_6c0 = (GeomMesh *)prop_name;
        local_4c8._0_8_ = puVar1;
        (anonymous_namespace)::
        ParseTypedAttribute<std::vector<tinyusdz::value::point3f,std::allocator<tinyusdz::value::point3f>>>
                  ((ParseResult *)local_668,(_anonymous_namespace_ *)local_698,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_50,(string *)prop_name,(Property *)local_4c8,(string *)local_228,pTVar19
                  );
        if ((uint *)local_4c8._0_8_ != puVar1) {
          operator_delete((void *)local_4c8._0_8_,
                          CONCAT17(local_4c8[0x17],
                                   CONCAT16(local_4c8[0x16],
                                            CONCAT15(local_4c8[0x15],
                                                     CONCAT14(local_4c8[0x14],
                                                              CONCAT13(local_4c8[0x13],
                                                                       CONCAT12(local_4c8[0x12],
                                                                                local_4c8._16_2_))))
                                           )) + 1);
        }
        if ((undefined8 *)local_50._0_8_ != local_40) {
          operator_delete((void *)local_50._0_8_,local_40[0] + 1);
        }
        iVar7 = 0;
        if ((local_668._0_8_ & 0xfffffffd) == 0) {
          iVar7 = 3;
LAB_00224084:
          bVar5 = false;
        }
        else {
          bVar5 = true;
          if (local_668._0_4_ != Unmatched) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4c8);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_4c8,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_4c8,"ReconstructPrim",0xf);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,"():",3);
            poVar8 = (ostream *)::std::ostream::operator<<((Property *)local_4c8,0xe67);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
            local_6e0._M_dataplus._M_p = (pointer)&local_6e0.field_2;
            local_6b0.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x28;
            local_6e0._M_dataplus._M_p =
                 (pointer)::std::__cxx11::string::_M_create((ulong *)&local_6e0,(ulong)&local_6b0);
            local_6e0.field_2._M_allocated_capacity =
                 (size_type)
                 local_6b0.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            *(undefined8 *)local_6e0._M_dataplus._M_p = 0x20676e6973726150;
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_6e0._M_dataplus._M_p + 8) = 'a';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_6e0._M_dataplus._M_p + 9) = 't';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_6e0._M_dataplus._M_p + 10) = 't';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_6e0._M_dataplus._M_p + 0xb) = 'r';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_6e0._M_dataplus._M_p + 0xc) = 'i';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_6e0._M_dataplus._M_p + 0xd) = 'b';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_6e0._M_dataplus._M_p + 0xe) = 'u';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_6e0._M_dataplus._M_p + 0xf) = 't';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_6e0._M_dataplus._M_p + 0x10) = 'e';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_6e0._M_dataplus._M_p + 0x11) = ' ';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_6e0._M_dataplus._M_p + 0x12) = '`';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_6e0._M_dataplus._M_p + 0x13) = '{';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_6e0._M_dataplus._M_p + 0x14) = '}';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_6e0._M_dataplus._M_p + 0x15) = '`';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_6e0._M_dataplus._M_p + 0x16) = ' ';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_6e0._M_dataplus._M_p + 0x17) = 'f';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_6e0._M_dataplus._M_p + 0x18) = 'a';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_6e0._M_dataplus._M_p + 0x19) = 'i';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_6e0._M_dataplus._M_p + 0x1a) = 'l';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_6e0._M_dataplus._M_p + 0x1b) = 'e';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_6e0._M_dataplus._M_p + 0x1c) = 'd';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_6e0._M_dataplus._M_p + 0x1d) = '.';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_6e0._M_dataplus._M_p + 0x1e) = ' ';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_6e0._M_dataplus._M_p + 0x1f) = 'E';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_6e0._M_dataplus._M_p + 0x20) = 'r';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_6e0._M_dataplus._M_p + 0x21) = 'r';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_6e0._M_dataplus._M_p + 0x22) = 'o';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_6e0._M_dataplus._M_p + 0x23) = 'r';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_6e0._M_dataplus._M_p + 0x24) = ':';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_6e0._M_dataplus._M_p + 0x25) = ' ';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_6e0._M_dataplus._M_p + 0x26) = '{';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_6e0._M_dataplus._M_p + 0x27) = '}';
            local_6e0._M_string_length =
                 (size_type)
                 local_6b0.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            local_6e0._M_dataplus._M_p
            [(long)local_6b0.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start] = '\0';
            prop_name = (uint *)(local_668 + 8);
            fmt::format<char[7],std::__cxx11::string>
                      ((string *)local_708,(fmt *)&local_6e0,(string *)"points",
                       (char (*) [7])prop_name,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar17)
            ;
            poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_4c8,(char *)local_708._0_8_,local_708._8_8_);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
            if ((GeomMesh *)local_708._0_8_ != (GeomMesh *)(local_708 + 0x10)) {
              operator_delete((void *)local_708._0_8_,(ulong)(local_708._16_8_ + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_6e0._M_dataplus._M_p != &local_6e0.field_2) {
              operator_delete(local_6e0._M_dataplus._M_p,
                              (ulong)(local_6e0.field_2._M_allocated_capacity + 1));
            }
            if (local_6e8 !=
                (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
                 *)0x0) {
              ::std::__cxx11::stringbuf::str();
              puVar9 = (undefined8 *)
                       ::std::__cxx11::string::_M_append
                                 ((char *)&local_6e0,(ulong)(local_6e8->_metas).interpolation);
              prop_name = (uint *)(puVar9 + 2);
              if ((GeomMesh *)*puVar9 == (GeomMesh *)prop_name) {
                local_708._16_8_ =
                     (((GeomMesh *)prop_name)->super_GPrim).super_Xformable.xformOps.
                     super__Vector_base<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>.
                     _M_impl.super__Vector_impl_data._M_start;
                local_708._24_8_ = puVar9[3];
                local_708._0_8_ = (GeomMesh *)(local_708 + 0x10);
              }
              else {
                local_708._16_8_ =
                     (((GeomMesh *)prop_name)->super_GPrim).super_Xformable.xformOps.
                     super__Vector_base<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>.
                     _M_impl.super__Vector_impl_data._M_start;
                local_708._0_8_ = (GeomMesh *)*puVar9;
              }
              local_708._8_8_ = puVar9[1];
              *puVar9 = prop_name;
              puVar9[1] = 0;
              *(undefined1 *)(puVar9 + 2) = 0;
              ::std::__cxx11::string::operator=((string *)local_6e8,(string *)local_708);
              if ((GeomMesh *)local_708._0_8_ != (GeomMesh *)(local_708 + 0x10)) {
                operator_delete((void *)local_708._0_8_,(ulong)(local_708._16_8_ + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_6e0._M_dataplus._M_p != &local_6e0.field_2) {
                operator_delete(local_6e0._M_dataplus._M_p,
                                (ulong)(local_6e0.field_2._M_allocated_capacity + 1));
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4c8);
            ::std::ios_base::~ios_base((ios_base *)(local_4c8 + 0x70));
            iVar7 = 1;
            goto LAB_00224084;
          }
        }
        if ((undefined1 *)local_668._8_8_ != local_658 + 8) {
          operator_delete((void *)local_668._8_8_,(ulong)(local_658._8_8_ + 1));
        }
        if (bVar5) {
          local_70._M_allocated_capacity = (size_type)local_60;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)(local_80 + 0x10),*(long *)(p_Var11 + 1),
                     (long)&(p_Var11[1]._M_parent)->_M_color + *(long *)(p_Var11 + 1));
          local_4c8[0x14] = 'a';
          local_4c8[0x15] = 'l';
          local_4c8[0x16] = 's';
          local_4c8._16_2_ = 0x6f6e;
          local_4c8[0x12] = 'r';
          local_4c8[0x13] = 'm';
          local_4c8._8_8_ = (GeomMesh *)0x7;
          local_4c8[0x17] = '\0';
          prop_name = (uint *)local_6c0;
          pPVar17 = (Property *)local_4c8;
          local_4c8._0_8_ = puVar1;
          (anonymous_namespace)::
          ParseTypedAttribute<std::vector<tinyusdz::value::normal3f,std::allocator<tinyusdz::value::normal3f>>>
                    ((ParseResult *)local_668,(_anonymous_namespace_ *)local_698,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)(local_80 + 0x10),(string *)local_6c0,(Property *)local_4c8,
                     (string *)local_288[2]._24_8_,
                     (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>_>
                      *)pTVar19);
          if ((uint *)local_4c8._0_8_ != puVar1) {
            operator_delete((void *)local_4c8._0_8_,
                            CONCAT17(local_4c8[0x17],
                                     CONCAT16(local_4c8[0x16],
                                              CONCAT15(local_4c8[0x15],
                                                       CONCAT14(local_4c8[0x14],
                                                                CONCAT13(local_4c8[0x13],
                                                                         CONCAT12(local_4c8[0x12],
                                                                                  local_4c8._16_2_))
                                                               )))) + 1);
          }
          if ((undefined8 *)local_70._M_allocated_capacity != local_60) {
            operator_delete((void *)local_70._M_allocated_capacity,local_60[0] + 1);
          }
          iVar7 = 0;
          if ((local_668._0_8_ & 0xfffffffd) == 0) {
            iVar7 = 3;
LAB_002243ec:
            bVar5 = false;
          }
          else {
            bVar5 = true;
            if (local_668._0_4_ != Unmatched) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4c8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4c8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4c8,"ReconstructPrim",0xf);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,"():",3);
              poVar8 = (ostream *)::std::ostream::operator<<((Property *)local_4c8,0xe68);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
              local_6e0._M_dataplus._M_p = (pointer)&local_6e0.field_2;
              local_6b0.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x28;
              local_6e0._M_dataplus._M_p =
                   (pointer)::std::__cxx11::string::_M_create((ulong *)&local_6e0,(ulong)&local_6b0)
              ;
              local_6e0.field_2._M_allocated_capacity =
                   (size_type)
                   local_6b0.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              *(undefined8 *)local_6e0._M_dataplus._M_p = 0x20676e6973726150;
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 8) = 'a';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 9) = 't';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 10) = 't';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0xb) = 'r';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0xc) = 'i';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0xd) = 'b';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0xe) = 'u';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0xf) = 't';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x10) = 'e';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x11) = ' ';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x12) = '`';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x13) = '{';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x14) = '}';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x15) = '`';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x16) = ' ';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x17) = 'f';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x18) = 'a';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x19) = 'i';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x1a) = 'l';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x1b) = 'e';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x1c) = 'd';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x1d) = '.';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x1e) = ' ';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x1f) = 'E';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x20) = 'r';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x21) = 'r';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x22) = 'o';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x23) = 'r';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x24) = ':';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x25) = ' ';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x26) = '{';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x27) = '}';
              local_6e0._M_string_length =
                   (size_type)
                   local_6b0.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              local_6e0._M_dataplus._M_p
              [(long)local_6b0.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start] = '\0';
              prop_name = (uint *)(local_668 + 8);
              fmt::format<char[8],std::__cxx11::string>
                        ((string *)local_708,(fmt *)&local_6e0,(string *)"normals",
                         (char (*) [8])prop_name,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         pPVar17);
              poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_4c8,(char *)local_708._0_8_,local_708._8_8_);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
              if ((GeomMesh *)local_708._0_8_ != (GeomMesh *)(local_708 + 0x10)) {
                operator_delete((void *)local_708._0_8_,(ulong)(local_708._16_8_ + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_6e0._M_dataplus._M_p != &local_6e0.field_2) {
                operator_delete(local_6e0._M_dataplus._M_p,
                                (ulong)(local_6e0.field_2._M_allocated_capacity + 1));
              }
              if (local_6e8 !=
                  (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
                   *)0x0) {
                ::std::__cxx11::stringbuf::str();
                puVar9 = (undefined8 *)
                         ::std::__cxx11::string::_M_append
                                   ((char *)&local_6e0,(ulong)(local_6e8->_metas).interpolation);
                prop_name = (uint *)(puVar9 + 2);
                if ((GeomMesh *)*puVar9 == (GeomMesh *)prop_name) {
                  local_708._16_8_ =
                       (((GeomMesh *)prop_name)->super_GPrim).super_Xformable.xformOps.
                       super__Vector_base<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>.
                       _M_impl.super__Vector_impl_data._M_start;
                  local_708._24_8_ = puVar9[3];
                  local_708._0_8_ = (GeomMesh *)(local_708 + 0x10);
                }
                else {
                  local_708._16_8_ =
                       (((GeomMesh *)prop_name)->super_GPrim).super_Xformable.xformOps.
                       super__Vector_base<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>.
                       _M_impl.super__Vector_impl_data._M_start;
                  local_708._0_8_ = (GeomMesh *)*puVar9;
                }
                local_708._8_8_ = puVar9[1];
                *puVar9 = prop_name;
                puVar9[1] = 0;
                *(undefined1 *)(puVar9 + 2) = 0;
                ::std::__cxx11::string::operator=((string *)local_6e8,(string *)local_708);
                if ((GeomMesh *)local_708._0_8_ != (GeomMesh *)(local_708 + 0x10)) {
                  operator_delete((void *)local_708._0_8_,(ulong)(local_708._16_8_ + 1));
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_6e0._M_dataplus._M_p != &local_6e0.field_2) {
                  operator_delete(local_6e0._M_dataplus._M_p,
                                  (ulong)(local_6e0.field_2._M_allocated_capacity + 1));
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4c8);
              ::std::ios_base::~ios_base((ios_base *)(local_4c8 + 0x70));
              iVar7 = 1;
              goto LAB_002243ec;
            }
          }
          if ((undefined1 *)local_668._8_8_ != local_658 + 8) {
            operator_delete((void *)local_668._8_8_,(ulong)(local_658._8_8_ + 1));
          }
          if (!bVar5) goto LAB_00227107;
          local_90._M_allocated_capacity = (size_type)local_80;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_90,*(long *)(p_Var11 + 1),
                     (long)&(p_Var11[1]._M_parent)->_M_color + *(long *)(p_Var11 + 1));
          local_708._0_8_ = (GeomMesh *)0x10;
          local_4c8._0_8_ = puVar1;
          local_4c8._0_8_ = ::std::__cxx11::string::_M_create((ulong *)local_4c8,(ulong)local_708);
          local_4c8._16_2_ = (undefined2)local_708._0_8_;
          local_4c8[0x12] = SUB81(local_708._0_8_,2);
          local_4c8[0x13] = SUB81(local_708._0_8_,3);
          local_4c8[0x14] = SUB81(local_708._0_8_,4);
          local_4c8[0x15] = SUB81(local_708._0_8_,5);
          local_4c8[0x16] = SUB81(local_708._0_8_,6);
          local_4c8[0x17] = SUB81(local_708._0_8_,7);
          *(undefined8 *)local_4c8._0_8_ = 0x7472655665636166;
          *(undefined8 *)(local_4c8._0_8_ + 8) = 0x73746e756f437865;
          local_4c8._8_8_ = local_708._0_8_;
          *(char *)(local_4c8._0_8_ + local_708._0_8_) = '\0';
          prop_name = (uint *)local_6c0;
          pPVar17 = (Property *)local_4c8;
          (anonymous_namespace)::ParseTypedAttribute<std::vector<int,std::allocator<int>>>
                    ((ParseResult *)local_668,(_anonymous_namespace_ *)local_698,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_90,(string *)local_6c0,(Property *)local_4c8,
                     (string *)local_288[2]._16_8_,
                     (TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_>
                      *)pTVar19);
          if ((uint *)local_4c8._0_8_ != puVar1) {
            operator_delete((void *)local_4c8._0_8_,
                            CONCAT17(local_4c8[0x17],
                                     CONCAT16(local_4c8[0x16],
                                              CONCAT15(local_4c8[0x15],
                                                       CONCAT14(local_4c8[0x14],
                                                                CONCAT13(local_4c8[0x13],
                                                                         CONCAT12(local_4c8[0x12],
                                                                                  local_4c8._16_2_))
                                                               )))) + 1);
          }
          if ((undefined1 *)local_90._M_allocated_capacity != local_80) {
            operator_delete((void *)local_90._M_allocated_capacity,local_80._0_8_ + 1);
          }
          iVar7 = 0;
          if ((local_668._0_8_ & 0xfffffffd) == 0) {
            iVar7 = 3;
LAB_0022477a:
            bVar5 = false;
          }
          else {
            bVar5 = true;
            if (local_668._0_4_ != Unmatched) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4c8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4c8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4c8,"ReconstructPrim",0xf);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,"():",3);
              poVar8 = (ostream *)::std::ostream::operator<<((Property *)local_4c8,0xe6a);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
              local_6e0._M_dataplus._M_p = (pointer)&local_6e0.field_2;
              local_6b0.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x28;
              local_6e0._M_dataplus._M_p =
                   (pointer)::std::__cxx11::string::_M_create((ulong *)&local_6e0,(ulong)&local_6b0)
              ;
              local_6e0.field_2._M_allocated_capacity =
                   (size_type)
                   local_6b0.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              *(undefined8 *)local_6e0._M_dataplus._M_p = 0x20676e6973726150;
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 8) = 'a';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 9) = 't';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 10) = 't';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0xb) = 'r';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0xc) = 'i';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0xd) = 'b';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0xe) = 'u';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0xf) = 't';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x10) = 'e';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x11) = ' ';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x12) = '`';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x13) = '{';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x14) = '}';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x15) = '`';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x16) = ' ';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x17) = 'f';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x18) = 'a';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x19) = 'i';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x1a) = 'l';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x1b) = 'e';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x1c) = 'd';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x1d) = '.';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x1e) = ' ';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x1f) = 'E';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x20) = 'r';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x21) = 'r';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x22) = 'o';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x23) = 'r';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x24) = ':';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x25) = ' ';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x26) = '{';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x27) = '}';
              local_6e0._M_string_length =
                   (size_type)
                   local_6b0.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              local_6e0._M_dataplus._M_p
              [(long)local_6b0.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start] = '\0';
              prop_name = (uint *)(local_668 + 8);
              fmt::format<char[17],std::__cxx11::string>
                        ((string *)local_708,(fmt *)&local_6e0,(string *)"faceVertexCounts",
                         (char (*) [17])prop_name,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         pPVar17);
              poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_4c8,(char *)local_708._0_8_,local_708._8_8_);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
              if ((GeomMesh *)local_708._0_8_ != (GeomMesh *)(local_708 + 0x10)) {
                operator_delete((void *)local_708._0_8_,(ulong)(local_708._16_8_ + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_6e0._M_dataplus._M_p != &local_6e0.field_2) {
                operator_delete(local_6e0._M_dataplus._M_p,
                                (ulong)(local_6e0.field_2._M_allocated_capacity + 1));
              }
              if (local_6e8 !=
                  (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
                   *)0x0) {
                ::std::__cxx11::stringbuf::str();
                puVar9 = (undefined8 *)
                         ::std::__cxx11::string::_M_append
                                   ((char *)&local_6e0,(ulong)(local_6e8->_metas).interpolation);
                prop_name = (uint *)(puVar9 + 2);
                if ((GeomMesh *)*puVar9 == (GeomMesh *)prop_name) {
                  local_708._16_8_ =
                       (((GeomMesh *)prop_name)->super_GPrim).super_Xformable.xformOps.
                       super__Vector_base<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>.
                       _M_impl.super__Vector_impl_data._M_start;
                  local_708._24_8_ = puVar9[3];
                  local_708._0_8_ = (GeomMesh *)(local_708 + 0x10);
                }
                else {
                  local_708._16_8_ =
                       (((GeomMesh *)prop_name)->super_GPrim).super_Xformable.xformOps.
                       super__Vector_base<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>.
                       _M_impl.super__Vector_impl_data._M_start;
                  local_708._0_8_ = (GeomMesh *)*puVar9;
                }
                local_708._8_8_ = puVar9[1];
                *puVar9 = prop_name;
                puVar9[1] = 0;
                *(undefined1 *)(puVar9 + 2) = 0;
                ::std::__cxx11::string::operator=((string *)local_6e8,(string *)local_708);
                if ((GeomMesh *)local_708._0_8_ != (GeomMesh *)(local_708 + 0x10)) {
                  operator_delete((void *)local_708._0_8_,(ulong)(local_708._16_8_ + 1));
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_6e0._M_dataplus._M_p != &local_6e0.field_2) {
                  operator_delete(local_6e0._M_dataplus._M_p,
                                  (ulong)(local_6e0.field_2._M_allocated_capacity + 1));
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4c8);
              ::std::ios_base::~ios_base((ios_base *)(local_4c8 + 0x70));
              iVar7 = 1;
              goto LAB_0022477a;
            }
          }
          if ((undefined1 *)local_668._8_8_ != local_658 + 8) {
            operator_delete((void *)local_668._8_8_,(ulong)(local_658._8_8_ + 1));
          }
          if (!bVar5) goto LAB_00227107;
          local_b0._M_allocated_capacity = (size_type)local_a0;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b0,*(long *)(p_Var11 + 1),
                     (long)&(p_Var11[1]._M_parent)->_M_color + *(long *)(p_Var11 + 1));
          local_708._0_8_ = (GeomMesh *)0x11;
          local_4c8._0_8_ = puVar1;
          local_4c8._0_8_ = ::std::__cxx11::string::_M_create((ulong *)local_4c8,(ulong)local_708);
          local_4c8._16_2_ = (undefined2)local_708._0_8_;
          local_4c8[0x12] = SUB81(local_708._0_8_,2);
          local_4c8[0x13] = SUB81(local_708._0_8_,3);
          local_4c8[0x14] = SUB81(local_708._0_8_,4);
          local_4c8[0x15] = SUB81(local_708._0_8_,5);
          local_4c8[0x16] = SUB81(local_708._0_8_,6);
          local_4c8[0x17] = SUB81(local_708._0_8_,7);
          *(undefined8 *)local_4c8._0_8_ = 0x7472655665636166;
          *(undefined8 *)(local_4c8._0_8_ + 8) = 0x656369646e497865;
          *(char *)(local_4c8._0_8_ + 0x10) = 's';
          local_4c8._8_8_ = local_708._0_8_;
          *(char *)(local_4c8._0_8_ + local_708._0_8_) = '\0';
          prop_name = (uint *)local_6c0;
          pPVar17 = (Property *)local_4c8;
          (anonymous_namespace)::ParseTypedAttribute<std::vector<int,std::allocator<int>>>
                    ((ParseResult *)local_668,(_anonymous_namespace_ *)local_698,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_b0,(string *)local_6c0,(Property *)local_4c8,
                     (string *)local_288[2]._0_8_,
                     (TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_>
                      *)pTVar19);
          if ((uint *)local_4c8._0_8_ != puVar1) {
            operator_delete((void *)local_4c8._0_8_,
                            CONCAT17(local_4c8[0x17],
                                     CONCAT16(local_4c8[0x16],
                                              CONCAT15(local_4c8[0x15],
                                                       CONCAT14(local_4c8[0x14],
                                                                CONCAT13(local_4c8[0x13],
                                                                         CONCAT12(local_4c8[0x12],
                                                                                  local_4c8._16_2_))
                                                               )))) + 1);
          }
          if ((undefined8 *)local_b0._M_allocated_capacity != local_a0) {
            operator_delete((void *)local_b0._M_allocated_capacity,local_a0[0] + 1);
          }
          iVar7 = 0;
          if ((local_668._0_8_ & 0xfffffffd) == 0) {
            iVar7 = 3;
LAB_00224b0c:
            bVar5 = false;
          }
          else {
            bVar5 = true;
            if (local_668._0_4_ != Unmatched) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4c8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4c8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4c8,"ReconstructPrim",0xf);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,"():",3);
              poVar8 = (ostream *)::std::ostream::operator<<((Property *)local_4c8,0xe6c);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
              local_6e0._M_dataplus._M_p = (pointer)&local_6e0.field_2;
              local_6b0.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x28;
              local_6e0._M_dataplus._M_p =
                   (pointer)::std::__cxx11::string::_M_create((ulong *)&local_6e0,(ulong)&local_6b0)
              ;
              local_6e0.field_2._M_allocated_capacity =
                   (size_type)
                   local_6b0.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              *(undefined8 *)local_6e0._M_dataplus._M_p = 0x20676e6973726150;
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 8) = 'a';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 9) = 't';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 10) = 't';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0xb) = 'r';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0xc) = 'i';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0xd) = 'b';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0xe) = 'u';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0xf) = 't';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x10) = 'e';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x11) = ' ';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x12) = '`';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x13) = '{';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x14) = '}';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x15) = '`';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x16) = ' ';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x17) = 'f';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x18) = 'a';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x19) = 'i';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x1a) = 'l';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x1b) = 'e';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x1c) = 'd';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x1d) = '.';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x1e) = ' ';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x1f) = 'E';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x20) = 'r';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x21) = 'r';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x22) = 'o';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x23) = 'r';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x24) = ':';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x25) = ' ';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x26) = '{';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x27) = '}';
              local_6e0._M_string_length =
                   (size_type)
                   local_6b0.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              local_6e0._M_dataplus._M_p
              [(long)local_6b0.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start] = '\0';
              prop_name = (uint *)(local_668 + 8);
              fmt::format<char[18],std::__cxx11::string>
                        ((string *)local_708,(fmt *)&local_6e0,(string *)"faceVertexIndices",
                         (char (*) [18])prop_name,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         pPVar17);
              poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_4c8,(char *)local_708._0_8_,local_708._8_8_);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
              if ((GeomMesh *)local_708._0_8_ != (GeomMesh *)(local_708 + 0x10)) {
                operator_delete((void *)local_708._0_8_,(ulong)(local_708._16_8_ + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_6e0._M_dataplus._M_p != &local_6e0.field_2) {
                operator_delete(local_6e0._M_dataplus._M_p,
                                (ulong)(local_6e0.field_2._M_allocated_capacity + 1));
              }
              if (local_6e8 !=
                  (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
                   *)0x0) {
                ::std::__cxx11::stringbuf::str();
                puVar9 = (undefined8 *)
                         ::std::__cxx11::string::_M_append
                                   ((char *)&local_6e0,(ulong)(local_6e8->_metas).interpolation);
                prop_name = (uint *)(puVar9 + 2);
                if ((GeomMesh *)*puVar9 == (GeomMesh *)prop_name) {
                  local_708._16_8_ =
                       (((GeomMesh *)prop_name)->super_GPrim).super_Xformable.xformOps.
                       super__Vector_base<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>.
                       _M_impl.super__Vector_impl_data._M_start;
                  local_708._24_8_ = puVar9[3];
                  local_708._0_8_ = (GeomMesh *)(local_708 + 0x10);
                }
                else {
                  local_708._16_8_ =
                       (((GeomMesh *)prop_name)->super_GPrim).super_Xformable.xformOps.
                       super__Vector_base<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>.
                       _M_impl.super__Vector_impl_data._M_start;
                  local_708._0_8_ = (GeomMesh *)*puVar9;
                }
                local_708._8_8_ = puVar9[1];
                *puVar9 = prop_name;
                puVar9[1] = 0;
                *(undefined1 *)(puVar9 + 2) = 0;
                ::std::__cxx11::string::operator=((string *)local_6e8,(string *)local_708);
                if ((GeomMesh *)local_708._0_8_ != (GeomMesh *)(local_708 + 0x10)) {
                  operator_delete((void *)local_708._0_8_,(ulong)(local_708._16_8_ + 1));
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_6e0._M_dataplus._M_p != &local_6e0.field_2) {
                  operator_delete(local_6e0._M_dataplus._M_p,
                                  (ulong)(local_6e0.field_2._M_allocated_capacity + 1));
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4c8);
              ::std::ios_base::~ios_base((ios_base *)(local_4c8 + 0x70));
              iVar7 = 1;
              goto LAB_00224b0c;
            }
          }
          if ((undefined1 *)local_668._8_8_ != local_658 + 8) {
            operator_delete((void *)local_668._8_8_,(ulong)(local_658._8_8_ + 1));
          }
          if (!bVar5) goto LAB_00227107;
          local_d0._M_allocated_capacity = (size_type)local_c0;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_d0,*(long *)(p_Var11 + 1),
                     (long)&(p_Var11[1]._M_parent)->_M_color + *(long *)(p_Var11 + 1));
          local_4c8[0x18] = 'd';
          local_4c8._25_2_ = 0x6369;
          local_4c8[0x1b] = 'e';
          local_4c8[0x1c] = 's';
          local_4c8._16_2_ = 0x6f63;
          local_4c8[0x12] = 'r';
          local_4c8[0x13] = 'n';
          local_4c8[0x14] = 'e';
          local_4c8[0x15] = 'r';
          local_4c8[0x16] = 'I';
          local_4c8[0x17] = 'n';
          local_4c8._8_8_ = (GeomMesh *)0xd;
          local_4c8[0x1d] = '\0';
          prop_name = (uint *)local_6c0;
          pPVar17 = (Property *)local_4c8;
          local_4c8._0_8_ = puVar1;
          (anonymous_namespace)::ParseTypedAttribute<std::vector<int,std::allocator<int>>>
                    ((ParseResult *)local_668,(_anonymous_namespace_ *)local_698,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_d0,(string *)local_6c0,(Property *)local_4c8,
                     (string *)local_288[1]._24_8_,
                     (TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_>
                      *)pTVar19);
          if ((uint *)local_4c8._0_8_ != puVar1) {
            operator_delete((void *)local_4c8._0_8_,
                            CONCAT17(local_4c8[0x17],
                                     CONCAT16(local_4c8[0x16],
                                              CONCAT15(local_4c8[0x15],
                                                       CONCAT14(local_4c8[0x14],
                                                                CONCAT13(local_4c8[0x13],
                                                                         CONCAT12(local_4c8[0x12],
                                                                                  local_4c8._16_2_))
                                                               )))) + 1);
          }
          if ((undefined8 *)local_d0._M_allocated_capacity != local_c0) {
            operator_delete((void *)local_d0._M_allocated_capacity,local_c0[0] + 1);
          }
          iVar7 = 0;
          if ((local_668._0_8_ & 0xfffffffd) == 0) {
            iVar7 = 3;
LAB_00224e80:
            bVar5 = false;
          }
          else {
            bVar5 = true;
            if (local_668._0_4_ != Unmatched) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4c8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4c8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4c8,"ReconstructPrim",0xf);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,"():",3);
              poVar8 = (ostream *)::std::ostream::operator<<((Property *)local_4c8,0xe6f);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
              local_6e0._M_dataplus._M_p = (pointer)&local_6e0.field_2;
              local_6b0.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x28;
              local_6e0._M_dataplus._M_p =
                   (pointer)::std::__cxx11::string::_M_create((ulong *)&local_6e0,(ulong)&local_6b0)
              ;
              local_6e0.field_2._M_allocated_capacity =
                   (size_type)
                   local_6b0.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              *(undefined8 *)local_6e0._M_dataplus._M_p = 0x20676e6973726150;
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 8) = 'a';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 9) = 't';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 10) = 't';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0xb) = 'r';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0xc) = 'i';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0xd) = 'b';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0xe) = 'u';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0xf) = 't';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x10) = 'e';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x11) = ' ';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x12) = '`';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x13) = '{';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x14) = '}';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x15) = '`';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x16) = ' ';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x17) = 'f';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x18) = 'a';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x19) = 'i';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x1a) = 'l';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x1b) = 'e';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x1c) = 'd';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x1d) = '.';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x1e) = ' ';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x1f) = 'E';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x20) = 'r';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x21) = 'r';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x22) = 'o';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x23) = 'r';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x24) = ':';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x25) = ' ';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x26) = '{';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x27) = '}';
              local_6e0._M_string_length =
                   (size_type)
                   local_6b0.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              local_6e0._M_dataplus._M_p
              [(long)local_6b0.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start] = '\0';
              prop_name = (uint *)(local_668 + 8);
              fmt::format<char[14],std::__cxx11::string>
                        ((string *)local_708,(fmt *)&local_6e0,(string *)"cornerIndices",
                         (char (*) [14])prop_name,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         pPVar17);
              poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_4c8,(char *)local_708._0_8_,local_708._8_8_);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
              if ((GeomMesh *)local_708._0_8_ != (GeomMesh *)(local_708 + 0x10)) {
                operator_delete((void *)local_708._0_8_,(ulong)(local_708._16_8_ + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_6e0._M_dataplus._M_p != &local_6e0.field_2) {
                operator_delete(local_6e0._M_dataplus._M_p,
                                (ulong)(local_6e0.field_2._M_allocated_capacity + 1));
              }
              if (local_6e8 !=
                  (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
                   *)0x0) {
                ::std::__cxx11::stringbuf::str();
                puVar9 = (undefined8 *)
                         ::std::__cxx11::string::_M_append
                                   ((char *)&local_6e0,(ulong)(local_6e8->_metas).interpolation);
                prop_name = (uint *)(puVar9 + 2);
                if ((GeomMesh *)*puVar9 == (GeomMesh *)prop_name) {
                  local_708._16_8_ =
                       (((GeomMesh *)prop_name)->super_GPrim).super_Xformable.xformOps.
                       super__Vector_base<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>.
                       _M_impl.super__Vector_impl_data._M_start;
                  local_708._24_8_ = puVar9[3];
                  local_708._0_8_ = (GeomMesh *)(local_708 + 0x10);
                }
                else {
                  local_708._16_8_ =
                       (((GeomMesh *)prop_name)->super_GPrim).super_Xformable.xformOps.
                       super__Vector_base<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>.
                       _M_impl.super__Vector_impl_data._M_start;
                  local_708._0_8_ = (GeomMesh *)*puVar9;
                }
                local_708._8_8_ = puVar9[1];
                *puVar9 = prop_name;
                puVar9[1] = 0;
                *(undefined1 *)(puVar9 + 2) = 0;
                ::std::__cxx11::string::operator=((string *)local_6e8,(string *)local_708);
                if ((GeomMesh *)local_708._0_8_ != (GeomMesh *)(local_708 + 0x10)) {
                  operator_delete((void *)local_708._0_8_,(ulong)(local_708._16_8_ + 1));
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_6e0._M_dataplus._M_p != &local_6e0.field_2) {
                  operator_delete(local_6e0._M_dataplus._M_p,
                                  (ulong)(local_6e0.field_2._M_allocated_capacity + 1));
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4c8);
              ::std::ios_base::~ios_base((ios_base *)(local_4c8 + 0x70));
              iVar7 = 1;
              goto LAB_00224e80;
            }
          }
          if ((undefined1 *)local_668._8_8_ != local_658 + 8) {
            operator_delete((void *)local_668._8_8_,(ulong)(local_658._8_8_ + 1));
          }
          if (!bVar5) goto LAB_00227107;
          local_f0._M_allocated_capacity = (size_type)local_e0;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)(local_100 + 0x10),*(long *)(p_Var11 + 1),
                     (long)&(p_Var11[1]._M_parent)->_M_color + *(long *)(p_Var11 + 1));
          local_708._0_8_ = (GeomMesh *)0x11;
          local_4c8._0_8_ = puVar1;
          local_4c8._0_8_ = ::std::__cxx11::string::_M_create((ulong *)local_4c8,(ulong)local_708);
          local_4c8._16_2_ = (undefined2)local_708._0_8_;
          local_4c8[0x12] = SUB81(local_708._0_8_,2);
          local_4c8[0x13] = SUB81(local_708._0_8_,3);
          local_4c8[0x14] = SUB81(local_708._0_8_,4);
          local_4c8[0x15] = SUB81(local_708._0_8_,5);
          local_4c8[0x16] = SUB81(local_708._0_8_,6);
          local_4c8[0x17] = SUB81(local_708._0_8_,7);
          *(undefined8 *)local_4c8._0_8_ = 0x685372656e726f63;
          *(undefined8 *)(local_4c8._0_8_ + 8) = 0x657373656e707261;
          *(char *)(local_4c8._0_8_ + 0x10) = 's';
          local_4c8._8_8_ = local_708._0_8_;
          *(char *)(local_4c8._0_8_ + local_708._0_8_) = '\0';
          prop_name = (uint *)local_6c0;
          pPVar17 = (Property *)local_4c8;
          (anonymous_namespace)::ParseTypedAttribute<std::vector<float,std::allocator<float>>>
                    ((ParseResult *)local_668,(_anonymous_namespace_ *)local_698,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)(local_100 + 0x10),(string *)local_6c0,(Property *)local_4c8,
                     (string *)local_288[1]._16_8_,
                     (TypedAttribute<tinyusdz::Animatable<std::vector<float,_std::allocator<float>_>_>_>
                      *)pTVar19);
          if ((uint *)local_4c8._0_8_ != puVar1) {
            operator_delete((void *)local_4c8._0_8_,
                            CONCAT17(local_4c8[0x17],
                                     CONCAT16(local_4c8[0x16],
                                              CONCAT15(local_4c8[0x15],
                                                       CONCAT14(local_4c8[0x14],
                                                                CONCAT13(local_4c8[0x13],
                                                                         CONCAT12(local_4c8[0x12],
                                                                                  local_4c8._16_2_))
                                                               )))) + 1);
          }
          if ((undefined8 *)local_f0._M_allocated_capacity != local_e0) {
            operator_delete((void *)local_f0._M_allocated_capacity,local_e0[0] + 1);
          }
          iVar7 = 0;
          if ((local_668._0_8_ & 0xfffffffd) == 0) {
            iVar7 = 3;
LAB_002251cc:
            bVar5 = false;
          }
          else {
            bVar5 = true;
            if (local_668._0_4_ != Unmatched) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4c8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4c8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4c8,"ReconstructPrim",0xf);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,"():",3);
              poVar8 = (ostream *)::std::ostream::operator<<((Property *)local_4c8,0xe71);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
              local_6e0._M_dataplus._M_p = (pointer)&local_6e0.field_2;
              local_6b0.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x28;
              local_6e0._M_dataplus._M_p =
                   (pointer)::std::__cxx11::string::_M_create((ulong *)&local_6e0,(ulong)&local_6b0)
              ;
              local_6e0.field_2._M_allocated_capacity =
                   (size_type)
                   local_6b0.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              *(undefined8 *)local_6e0._M_dataplus._M_p = 0x20676e6973726150;
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 8) = 'a';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 9) = 't';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 10) = 't';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0xb) = 'r';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0xc) = 'i';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0xd) = 'b';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0xe) = 'u';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0xf) = 't';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x10) = 'e';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x11) = ' ';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x12) = '`';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x13) = '{';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x14) = '}';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x15) = '`';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x16) = ' ';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x17) = 'f';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x18) = 'a';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x19) = 'i';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x1a) = 'l';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x1b) = 'e';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x1c) = 'd';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x1d) = '.';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x1e) = ' ';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x1f) = 'E';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x20) = 'r';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x21) = 'r';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x22) = 'o';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x23) = 'r';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x24) = ':';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x25) = ' ';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x26) = '{';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p + 0x27) = '}';
              local_6e0._M_string_length =
                   (size_type)
                   local_6b0.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              local_6e0._M_dataplus._M_p
              [(long)local_6b0.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start] = '\0';
              prop_name = (uint *)(local_668 + 8);
              fmt::format<char[18],std::__cxx11::string>
                        ((string *)local_708,(fmt *)&local_6e0,(string *)"cornerSharpnesses",
                         (char (*) [18])prop_name,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         pPVar17);
              poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_4c8,(char *)local_708._0_8_,local_708._8_8_);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
              if ((GeomMesh *)local_708._0_8_ != (GeomMesh *)(local_708 + 0x10)) {
                operator_delete((void *)local_708._0_8_,(ulong)(local_708._16_8_ + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_6e0._M_dataplus._M_p != &local_6e0.field_2) {
                operator_delete(local_6e0._M_dataplus._M_p,
                                (ulong)(local_6e0.field_2._M_allocated_capacity + 1));
              }
              if (local_6e8 !=
                  (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
                   *)0x0) {
                ::std::__cxx11::stringbuf::str();
                pTVar4 = local_6e8;
                ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_708,&local_6e0,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_6e8);
                ::std::__cxx11::string::operator=((string *)pTVar4,(string *)local_708);
                if ((GeomMesh *)local_708._0_8_ != (GeomMesh *)(local_708 + 0x10)) {
                  operator_delete((void *)local_708._0_8_,(ulong)(local_708._16_8_ + 1));
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_6e0._M_dataplus._M_p != &local_6e0.field_2) {
                  operator_delete(local_6e0._M_dataplus._M_p,
                                  (ulong)(local_6e0.field_2._M_allocated_capacity + 1));
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4c8);
              ::std::ios_base::~ios_base((ios_base *)(local_4c8 + 0x70));
              iVar7 = 1;
              goto LAB_002251cc;
            }
          }
          if ((undefined1 *)local_668._8_8_ != local_658 + 8) {
            operator_delete((void *)local_668._8_8_,(ulong)(local_658._8_8_ + 1));
          }
          if (!bVar5) goto LAB_00227107;
          local_110._M_allocated_capacity = (size_type)(local_120 + 0x20);
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)(local_120 + 0x10),*(long *)(p_Var11 + 1),
                     (long)&(p_Var11[1]._M_parent)->_M_color + *(long *)(p_Var11 + 1));
          local_4c8[0x18] = 'd';
          local_4c8._25_2_ = 0x6369;
          local_4c8[0x1b] = 'e';
          local_4c8[0x1c] = 's';
          local_4c8._16_2_ = 0x7263;
          local_4c8[0x12] = 'e';
          local_4c8[0x13] = 'a';
          local_4c8[0x14] = 's';
          local_4c8[0x15] = 'e';
          local_4c8[0x16] = 'I';
          local_4c8[0x17] = 'n';
          local_4c8._8_8_ = (GeomMesh *)0xd;
          local_4c8[0x1d] = '\0';
          prop_name = (uint *)local_6c0;
          pPVar17 = (Property *)local_4c8;
          local_4c8._0_8_ = puVar1;
          (anonymous_namespace)::ParseTypedAttribute<std::vector<int,std::allocator<int>>>
                    ((ParseResult *)local_668,(_anonymous_namespace_ *)local_698,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)(local_120 + 0x10),(string *)local_6c0,(Property *)local_4c8,
                     (string *)local_288[1]._8_8_,
                     (TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_>
                      *)pTVar19);
          if ((uint *)local_4c8._0_8_ != puVar1) {
            operator_delete((void *)local_4c8._0_8_,
                            CONCAT17(local_4c8[0x17],
                                     CONCAT16(local_4c8[0x16],
                                              CONCAT15(local_4c8[0x15],
                                                       CONCAT14(local_4c8[0x14],
                                                                CONCAT13(local_4c8[0x13],
                                                                         CONCAT12(local_4c8[0x12],
                                                                                  local_4c8._16_2_))
                                                               )))) + 1);
          }
          if ((undefined1 *)local_110._M_allocated_capacity != local_120 + 0x20) {
            operator_delete((void *)local_110._M_allocated_capacity,local_100._0_8_ + 1);
          }
          iVar7 = 0;
          if ((local_668._0_8_ & 0xfffffffd) == 0) {
            iVar7 = 3;
LAB_002254bd:
            bVar5 = false;
          }
          else {
            bVar5 = true;
            if (local_668._0_4_ != Unmatched) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4c8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4c8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4c8,"ReconstructPrim",0xf);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,"():",3);
              poVar8 = (ostream *)::std::ostream::operator<<((Property *)local_4c8,0xe73);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
              local_6e0._M_dataplus._M_p = (pointer)&local_6e0.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_6e0,"Parsing attribute `{}` failed. Error: {}","");
              prop_name = (uint *)(local_668 + 8);
              fmt::format<char[14],std::__cxx11::string>
                        ((string *)local_708,(fmt *)&local_6e0,(string *)"creaseIndices",
                         (char (*) [14])prop_name,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         pPVar17);
              poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_4c8,(char *)local_708._0_8_,local_708._8_8_);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
              if ((GeomMesh *)local_708._0_8_ != (GeomMesh *)(local_708 + 0x10)) {
                operator_delete((void *)local_708._0_8_,(ulong)(local_708._16_8_ + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_6e0._M_dataplus._M_p != &local_6e0.field_2) {
                operator_delete(local_6e0._M_dataplus._M_p,
                                (ulong)(local_6e0.field_2._M_allocated_capacity + 1));
              }
              if (local_6e8 !=
                  (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
                   *)0x0) {
                ::std::__cxx11::stringbuf::str();
                pTVar4 = local_6e8;
                ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_708,&local_6e0,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_6e8);
                ::std::__cxx11::string::operator=((string *)pTVar4,(string *)local_708);
                if ((GeomMesh *)local_708._0_8_ != (GeomMesh *)(local_708 + 0x10)) {
                  operator_delete((void *)local_708._0_8_,(ulong)(local_708._16_8_ + 1));
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_6e0._M_dataplus._M_p != &local_6e0.field_2) {
                  operator_delete(local_6e0._M_dataplus._M_p,
                                  (ulong)(local_6e0.field_2._M_allocated_capacity + 1));
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4c8);
              ::std::ios_base::~ios_base((ios_base *)(local_4c8 + 0x70));
              iVar7 = 1;
              goto LAB_002254bd;
            }
          }
          if ((undefined1 *)local_668._8_8_ != local_658 + 8) {
            operator_delete((void *)local_668._8_8_,(ulong)(local_658._8_8_ + 1));
          }
          if (!bVar5) goto LAB_00227107;
          local_130._0_8_ = local_120;
          ::std::__cxx11::string::_M_construct<char*>
                    (local_130,*(long *)(p_Var11 + 1),
                     (long)&(p_Var11[1]._M_parent)->_M_color + *(long *)(p_Var11 + 1));
          local_4c8[0x18] = 'n';
          local_4c8._25_2_ = 0x7467;
          local_4c8[0x1b] = 'h';
          local_4c8[0x1c] = 's';
          local_4c8._16_2_ = 0x7263;
          local_4c8[0x12] = 'e';
          local_4c8[0x13] = 'a';
          local_4c8[0x14] = 's';
          local_4c8[0x15] = 'e';
          local_4c8[0x16] = 'L';
          local_4c8[0x17] = 'e';
          local_4c8._8_8_ = (GeomMesh *)0xd;
          local_4c8[0x1d] = '\0';
          prop_name = (uint *)local_6c0;
          pPVar17 = (Property *)local_4c8;
          local_4c8._0_8_ = puVar1;
          (anonymous_namespace)::ParseTypedAttribute<std::vector<int,std::allocator<int>>>
                    ((ParseResult *)local_668,(_anonymous_namespace_ *)local_698,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_130,(string *)local_6c0,(Property *)local_4c8,
                     (string *)local_288[1]._0_8_,
                     (TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_>
                      *)pTVar19);
          if ((uint *)local_4c8._0_8_ != puVar1) {
            operator_delete((void *)local_4c8._0_8_,
                            CONCAT17(local_4c8[0x17],
                                     CONCAT16(local_4c8[0x16],
                                              CONCAT15(local_4c8[0x15],
                                                       CONCAT14(local_4c8[0x14],
                                                                CONCAT13(local_4c8[0x13],
                                                                         CONCAT12(local_4c8[0x12],
                                                                                  local_4c8._16_2_))
                                                               )))) + 1);
          }
          if ((pointer)local_130._0_8_ != (pointer)local_120) {
            operator_delete((void *)local_130._0_8_,local_120._0_8_ + 1);
          }
          iVar7 = 0;
          if ((local_668._0_8_ & 0xfffffffd) == 0) {
            iVar7 = 3;
LAB_002257ae:
            bVar5 = false;
          }
          else {
            bVar5 = true;
            if (local_668._0_4_ != Unmatched) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4c8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4c8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4c8,"ReconstructPrim",0xf);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,"():",3);
              poVar8 = (ostream *)::std::ostream::operator<<((Property *)local_4c8,0xe75);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
              local_6e0._M_dataplus._M_p = (pointer)&local_6e0.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_6e0,"Parsing attribute `{}` failed. Error: {}","");
              prop_name = (uint *)(local_668 + 8);
              fmt::format<char[14],std::__cxx11::string>
                        ((string *)local_708,(fmt *)&local_6e0,(string *)"creaseLengths",
                         (char (*) [14])prop_name,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         pPVar17);
              poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_4c8,(char *)local_708._0_8_,local_708._8_8_);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
              if ((GeomMesh *)local_708._0_8_ != (GeomMesh *)(local_708 + 0x10)) {
                operator_delete((void *)local_708._0_8_,(ulong)(local_708._16_8_ + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_6e0._M_dataplus._M_p != &local_6e0.field_2) {
                operator_delete(local_6e0._M_dataplus._M_p,
                                (ulong)(local_6e0.field_2._M_allocated_capacity + 1));
              }
              if (local_6e8 !=
                  (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
                   *)0x0) {
                ::std::__cxx11::stringbuf::str();
                pTVar4 = local_6e8;
                ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_708,&local_6e0,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_6e8);
                ::std::__cxx11::string::operator=((string *)pTVar4,(string *)local_708);
                if ((GeomMesh *)local_708._0_8_ != (GeomMesh *)(local_708 + 0x10)) {
                  operator_delete((void *)local_708._0_8_,(ulong)(local_708._16_8_ + 1));
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_6e0._M_dataplus._M_p != &local_6e0.field_2) {
                  operator_delete(local_6e0._M_dataplus._M_p,
                                  (ulong)(local_6e0.field_2._M_allocated_capacity + 1));
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4c8);
              ::std::ios_base::~ios_base((ios_base *)(local_4c8 + 0x70));
              iVar7 = 1;
              goto LAB_002257ae;
            }
          }
          if ((undefined1 *)local_668._8_8_ != local_658 + 8) {
            operator_delete((void *)local_668._8_8_,(ulong)(local_658._8_8_ + 1));
          }
          if (!bVar5) goto LAB_00227107;
          local_150._0_8_ = local_140;
          ::std::__cxx11::string::_M_construct<char*>
                    (local_150,*(long *)(p_Var11 + 1),
                     (long)&(p_Var11[1]._M_parent)->_M_color + *(long *)(p_Var11 + 1));
          local_4c8._0_8_ = puVar1;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_4c8,"creaseSharpnesses","");
          prop_name = (uint *)local_6c0;
          pPVar17 = (Property *)local_4c8;
          (anonymous_namespace)::ParseTypedAttribute<std::vector<float,std::allocator<float>>>
                    ((ParseResult *)local_668,(_anonymous_namespace_ *)local_698,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_150,(string *)local_6c0,(Property *)local_4c8,
                     (string *)local_288[0]._24_8_,
                     (TypedAttribute<tinyusdz::Animatable<std::vector<float,_std::allocator<float>_>_>_>
                      *)pTVar19);
          if ((uint *)local_4c8._0_8_ != puVar1) {
            operator_delete((void *)local_4c8._0_8_,
                            CONCAT17(local_4c8[0x17],
                                     CONCAT16(local_4c8[0x16],
                                              CONCAT15(local_4c8[0x15],
                                                       CONCAT14(local_4c8[0x14],
                                                                CONCAT13(local_4c8[0x13],
                                                                         CONCAT12(local_4c8[0x12],
                                                                                  local_4c8._16_2_))
                                                               )))) + 1);
          }
          if ((undefined1 *)local_150._0_8_ != local_140) {
            operator_delete((void *)local_150._0_8_,(ulong)(local_140._0_8_ + 1));
          }
          iVar7 = 0;
          if ((local_668._0_8_ & 0xfffffffd) == 0) {
            iVar7 = 3;
LAB_00225a84:
            bVar5 = false;
          }
          else {
            bVar5 = true;
            if (local_668._0_4_ != Unmatched) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4c8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4c8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4c8,"ReconstructPrim",0xf);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,"():",3);
              poVar8 = (ostream *)::std::ostream::operator<<((Property *)local_4c8,0xe77);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
              local_6e0._M_dataplus._M_p = (pointer)&local_6e0.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_6e0,"Parsing attribute `{}` failed. Error: {}","");
              prop_name = (uint *)(local_668 + 8);
              fmt::format<char[18],std::__cxx11::string>
                        ((string *)local_708,(fmt *)&local_6e0,(string *)"creaseSharpnesses",
                         (char (*) [18])prop_name,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         pPVar17);
              poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_4c8,(char *)local_708._0_8_,local_708._8_8_);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
              if ((GeomMesh *)local_708._0_8_ != (GeomMesh *)(local_708 + 0x10)) {
                operator_delete((void *)local_708._0_8_,(ulong)(local_708._16_8_ + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_6e0._M_dataplus._M_p != &local_6e0.field_2) {
                operator_delete(local_6e0._M_dataplus._M_p,
                                (ulong)(local_6e0.field_2._M_allocated_capacity + 1));
              }
              if (local_6e8 !=
                  (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
                   *)0x0) {
                ::std::__cxx11::stringbuf::str();
                pTVar4 = local_6e8;
                ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_708,&local_6e0,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_6e8);
                ::std::__cxx11::string::operator=((string *)pTVar4,(string *)local_708);
                if ((GeomMesh *)local_708._0_8_ != (GeomMesh *)(local_708 + 0x10)) {
                  operator_delete((void *)local_708._0_8_,(ulong)(local_708._16_8_ + 1));
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_6e0._M_dataplus._M_p != &local_6e0.field_2) {
                  operator_delete(local_6e0._M_dataplus._M_p,
                                  (ulong)(local_6e0.field_2._M_allocated_capacity + 1));
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4c8);
              ::std::ios_base::~ios_base((ios_base *)(local_4c8 + 0x70));
              iVar7 = 1;
              goto LAB_00225a84;
            }
          }
          if ((undefined1 *)local_668._8_8_ != local_658 + 8) {
            operator_delete((void *)local_668._8_8_,(ulong)(local_658._8_8_ + 1));
          }
          if (!bVar5) goto LAB_00227107;
          local_170._0_8_ = &local_160;
          ::std::__cxx11::string::_M_construct<char*>
                    (local_170,*(long *)(p_Var11 + 1),
                     (long)&(p_Var11[1]._M_parent)->_M_color + *(long *)(p_Var11 + 1));
          local_4c8._16_2_ = 0x6f68;
          local_4c8[0x12] = 'l';
          local_4c8[0x13] = 'e';
          local_4c8[0x14] = 'I';
          local_4c8[0x15] = 'n';
          local_4c8[0x16] = 'd';
          local_4c8[0x17] = 'i';
          local_4c8[0x18] = 'c';
          local_4c8._25_2_ = 0x7365;
          local_4c8._8_8_ = (GeomMesh *)0xb;
          local_4c8[0x1b] = '\0';
          prop_name = (uint *)local_6c0;
          pPVar17 = (Property *)local_4c8;
          local_4c8._0_8_ = puVar1;
          (anonymous_namespace)::ParseTypedAttribute<std::vector<int,std::allocator<int>>>
                    ((ParseResult *)local_668,(_anonymous_namespace_ *)local_698,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_170,(string *)local_6c0,(Property *)local_4c8,
                     (string *)local_288[0]._16_8_,
                     (TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_>
                      *)pTVar19);
          if ((uint *)local_4c8._0_8_ != puVar1) {
            operator_delete((void *)local_4c8._0_8_,
                            CONCAT17(local_4c8[0x17],
                                     CONCAT16(local_4c8[0x16],
                                              CONCAT15(local_4c8[0x15],
                                                       CONCAT14(local_4c8[0x14],
                                                                CONCAT13(local_4c8[0x13],
                                                                         CONCAT12(local_4c8[0x12],
                                                                                  local_4c8._16_2_))
                                                               )))) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_170._0_8_ != &local_160) {
            operator_delete((void *)local_170._0_8_,local_160._M_allocated_capacity + 1);
          }
          iVar7 = 0;
          if ((local_668._0_8_ & 0xfffffffd) == 0) {
            iVar7 = 3;
LAB_00225d6f:
            bVar5 = false;
          }
          else {
            bVar5 = true;
            if (local_668._0_4_ != Unmatched) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4c8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4c8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4c8,"ReconstructPrim",0xf);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,"():",3);
              poVar8 = (ostream *)::std::ostream::operator<<((Property *)local_4c8,0xe79);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
              local_6e0._M_dataplus._M_p = (pointer)&local_6e0.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_6e0,"Parsing attribute `{}` failed. Error: {}","");
              prop_name = (uint *)(local_668 + 8);
              fmt::format<char[12],std::__cxx11::string>
                        ((string *)local_708,(fmt *)&local_6e0,(string *)"holeIndices",
                         (char (*) [12])prop_name,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         pPVar17);
              poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_4c8,(char *)local_708._0_8_,local_708._8_8_);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
              if ((GeomMesh *)local_708._0_8_ != (GeomMesh *)(local_708 + 0x10)) {
                operator_delete((void *)local_708._0_8_,(ulong)(local_708._16_8_ + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_6e0._M_dataplus._M_p != &local_6e0.field_2) {
                operator_delete(local_6e0._M_dataplus._M_p,
                                (ulong)(local_6e0.field_2._M_allocated_capacity + 1));
              }
              if (local_6e8 !=
                  (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
                   *)0x0) {
                ::std::__cxx11::stringbuf::str();
                pTVar4 = local_6e8;
                ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_708,&local_6e0,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_6e8);
                ::std::__cxx11::string::operator=((string *)pTVar4,(string *)local_708);
                if ((GeomMesh *)local_708._0_8_ != (GeomMesh *)(local_708 + 0x10)) {
                  operator_delete((void *)local_708._0_8_,(ulong)(local_708._16_8_ + 1));
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_6e0._M_dataplus._M_p != &local_6e0.field_2) {
                  operator_delete(local_6e0._M_dataplus._M_p,
                                  (ulong)(local_6e0.field_2._M_allocated_capacity + 1));
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4c8);
              ::std::ios_base::~ios_base((ios_base *)(local_4c8 + 0x70));
              iVar7 = 1;
              goto LAB_00225d6f;
            }
          }
          if ((undefined1 *)local_668._8_8_ != local_658 + 8) {
            operator_delete((void *)local_668._8_8_,(ulong)(local_658._8_8_ + 1));
          }
          if (!bVar5) goto LAB_00227107;
          iVar7 = ::std::__cxx11::string::compare((char *)__v);
          if (iVar7 == 0) {
            local_4c8._0_8_ = puVar1;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_4c8,"subdivisionScheme","");
            cVar10 = ::std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_698,(key_type *)local_4c8);
            if ((uint *)local_4c8._0_8_ != puVar1) {
              operator_delete((void *)local_4c8._0_8_,
                              CONCAT17(local_4c8[0x17],
                                       CONCAT16(local_4c8[0x16],
                                                CONCAT15(local_4c8[0x15],
                                                         CONCAT14(local_4c8[0x14],
                                                                  CONCAT13(local_4c8[0x13],
                                                                           CONCAT12(local_4c8[0x12],
                                                                                    local_4c8._16_2_
                                                                                   )))))) + 1);
            }
            if (cVar10._M_node == (_Base_ptr)local_690) {
              if (((ulong)p_Var11[0x17]._M_parent & 0xfffffffe00000000) != 0x200000000) {
                Attribute::type_name_abi_cxx11_((string *)local_4c8,(Attribute *)local_6c0);
                local_668._0_8_ = local_658;
                local_668._8_8_ = (pointer)0x5;
                local_658._0_6_ = 0x6e656b6f74;
                if ((((GeomMesh *)local_4c8._8_8_ == (GeomMesh *)0x5) &&
                    (uVar13 = (uint)(*(byte *)(local_4c8._0_8_ + 4) ^ 0x6e) |
                              *(uint *)local_4c8._0_8_ ^ 0x656b6f74,
                    prop_name = (uint *)(ulong)uVar13, uVar13 == 0)) &&
                   (uVar13 = *(uint *)((long)&p_Var11[0x17]._M_parent + 4), uVar13 < 2)) {
                  if ((uint *)local_4c8._0_8_ != puVar1) {
                    operator_delete((void *)local_4c8._0_8_,
                                    CONCAT17(local_4c8[0x17],
                                             CONCAT16(local_4c8[0x16],
                                                      CONCAT15(local_4c8[0x15],
                                                               CONCAT14(local_4c8[0x14],
                                                                        CONCAT13(local_4c8[0x13],
                                                                                 CONCAT12(local_4c8[
                                                  0x12],local_4c8._16_2_)))))) + 1);
                  }
                  if (uVar13 == 0) {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4c8);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_4c8,"[warn]",6);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_4c8,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                               ,0x5a);
                    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,":",1)
                    ;
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_4c8,"ReconstructPrim",0xf);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_4c8,"():",3);
                    poVar8 = (ostream *)::std::ostream::operator<<((Property *)local_4c8,0xe7c);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_4c8,"No value assigned to `",0x16);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_4c8,"subdivisionScheme",0x11);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_4c8,"` token attribute. Set default token value.",
                               0x2b);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_4c8,"\n",1);
                    if (local_6b8 != (string *)0x0) {
                      ::std::__cxx11::stringbuf::str();
                      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_668,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_708,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_6e8);
                      ::std::__cxx11::string::operator=((string *)local_6b8,(string *)local_668);
                      if ((GeomMesh *)local_668._0_8_ != (GeomMesh *)local_658) {
                        operator_delete((void *)local_668._0_8_,(ulong)(local_658._0_8_ + 1));
                      }
                      if ((GeomMesh *)local_708._0_8_ != (GeomMesh *)(local_708 + 0x10)) {
                        operator_delete((void *)local_708._0_8_,(ulong)(local_708._16_8_ + 1));
                      }
                    }
                    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4c8);
                    ::std::ios_base::~ios_base((ios_base *)(local_4c8 + 0x70));
                    AttrMetas::operator=((AttrMetas *)local_5f8._288_8_,(AttrMetas *)(p_Var11 + 7));
                    pcVar16 = "subdivisionScheme";
                    pcVar15 = "";
LAB_002268d7:
                    local_4c8._0_8_ = puVar1;
                    ::std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_4c8,pcVar16,pcVar15);
                    ::std::
                    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    ::_M_insert_unique<std::__cxx11::string>
                              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                *)local_698,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_4c8);
                    if ((uint *)local_4c8._0_8_ != puVar1) {
                      operator_delete((void *)local_4c8._0_8_,
                                      CONCAT17(local_4c8[0x17],
                                               CONCAT16(local_4c8[0x16],
                                                        CONCAT15(local_4c8[0x15],
                                                                 CONCAT14(local_4c8[0x14],
                                                                          CONCAT13(local_4c8[0x13],
                                                                                   CONCAT12(
                                                  local_4c8[0x12],local_4c8._16_2_)))))) + 1);
                    }
                    goto LAB_00227116;
                  }
                }
                else if ((uint *)local_4c8._0_8_ != puVar1) {
                  operator_delete((void *)local_4c8._0_8_,
                                  CONCAT17(local_4c8[0x17],
                                           CONCAT16(local_4c8[0x16],
                                                    CONCAT15(local_4c8[0x15],
                                                             CONCAT14(local_4c8[0x14],
                                                                      CONCAT13(local_4c8[0x13],
                                                                               CONCAT12(local_4c8[
                                                  0x12],local_4c8._16_2_)))))) + 1);
                }
              }
              local_4c8._0_8_ = (uint *)0x0;
              local_4c8._8_8_ = (GeomMesh *)0x0;
              local_4c8[0x18] = -0x5c;
              local_4c8._25_2_ = 0x259f;
              local_4c8[0x1b] = '\0';
              local_4c8[0x1c] = '\0';
              local_4c8[0x1d] = '\0';
              local_4c8._30_2_ = 0;
              local_4c8._16_2_ = 0xa9f2;
              local_4c8[0x12] = '%';
              local_4c8[0x13] = '\0';
              local_4c8[0x14] = '\0';
              local_4c8[0x15] = '\0';
              local_4c8[0x16] = '\0';
              local_4c8[0x17] = '\0';
              local_668._0_8_ = local_658;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_668,"subdivisionScheme","");
              bVar5 = options->strict_allowedToken_check;
              local_1c8 = (code *)0x0;
              auStack_1c0 = (undefined1  [8])0x0;
              local_1d8._M_unused._M_object = (void *)0x0;
              local_1d8._8_8_ = (pointer)0x0;
              pcVar3 = (code *)CONCAT17(local_4c8[0x17],
                                        CONCAT16(local_4c8[0x16],
                                                 CONCAT15(local_4c8[0x15],
                                                          CONCAT14(local_4c8[0x14],
                                                                   CONCAT13(local_4c8[0x13],
                                                                            CONCAT12(local_4c8[0x12]
                                                                                     ,local_4c8.
                                                                                      _16_2_))))));
              if (pcVar3 != (code *)0x0) {
                (*pcVar3)(&local_1d8,(Property *)local_4c8,2);
                local_1c8 = CONCAT17(local_4c8[0x17],
                                     CONCAT16(local_4c8[0x16],
                                              CONCAT15(local_4c8[0x15],
                                                       CONCAT14(local_4c8[0x14],
                                                                CONCAT13(local_4c8[0x13],
                                                                         CONCAT12(local_4c8[0x12],
                                                                                  local_4c8._16_2_))
                                                               ))));
                auStack_1c0 = (undefined1  [8])
                              CONCAT26(local_4c8._30_2_,
                                       CONCAT15(local_4c8[0x1d],
                                                CONCAT14(local_4c8[0x1c],
                                                         CONCAT13(local_4c8[0x1b],
                                                                  CONCAT21(local_4c8._25_2_,
                                                                           local_4c8[0x18])))));
              }
              prop_name = (uint *)local_6c0;
              pTVar19 = local_6e8;
              bVar5 = ParseUniformEnumProperty<tinyusdz::GeomMesh::SubdivisionScheme,tinyusdz::GeomMesh::SubdivisionScheme>
                                ((string *)local_668,bVar5,
                                 (EnumHandlerFun<tinyusdz::GeomMesh::SubdivisionScheme> *)&local_1d8
                                 ,(Attribute *)local_6c0,
                                 (TypedAttributeWithFallback<tinyusdz::GeomMesh::SubdivisionScheme>
                                  *)local_5f8._288_8_,local_6b8,(string *)local_6e8);
              if ((code *)local_1c8 != (code *)0x0) {
                (*(code *)local_1c8)(&local_1d8,&local_1d8,3);
              }
              if ((GeomMesh *)local_668._0_8_ != (GeomMesh *)local_658) {
                operator_delete((void *)local_668._0_8_,(ulong)(local_658._0_8_ + 1));
              }
              iVar7 = 1;
              if (bVar5) {
                AttrMetas::operator=((AttrMetas *)local_5f8._288_8_,(AttrMetas *)(p_Var11 + 7));
                pcVar16 = "subdivisionScheme";
                pcVar15 = "";
                goto LAB_002270ba;
              }
LAB_002270ed:
              pcVar3 = (code *)CONCAT17(local_4c8[0x17],
                                        CONCAT16(local_4c8[0x16],
                                                 CONCAT15(local_4c8[0x15],
                                                          CONCAT14(local_4c8[0x14],
                                                                   CONCAT13(local_4c8[0x13],
                                                                            CONCAT12(local_4c8[0x12]
                                                                                     ,local_4c8.
                                                                                      _16_2_))))));
              if (pcVar3 != (code *)0x0) {
                (*pcVar3)((Property *)local_4c8,(Property *)local_4c8,3);
              }
              goto LAB_00227107;
            }
          }
          else {
            iVar7 = ::std::__cxx11::string::compare((char *)__v);
            if (iVar7 == 0) {
              local_4c8._0_8_ = puVar1;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_4c8,"interpolateBoundary","");
              cVar10 = ::std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_698,(key_type *)local_4c8);
              if ((uint *)local_4c8._0_8_ != puVar1) {
                operator_delete((void *)local_4c8._0_8_,
                                CONCAT17(local_4c8[0x17],
                                         CONCAT16(local_4c8[0x16],
                                                  CONCAT15(local_4c8[0x15],
                                                           CONCAT14(local_4c8[0x14],
                                                                    CONCAT13(local_4c8[0x13],
                                                                             CONCAT12(local_4c8[0x12
                                                  ],local_4c8._16_2_)))))) + 1);
              }
              if (cVar10._M_node == (_Base_ptr)local_690) {
                if (((ulong)p_Var11[0x17]._M_parent & 0xfffffffe00000000) != 0x200000000) {
                  Attribute::type_name_abi_cxx11_((string *)local_4c8,(Attribute *)local_6c0);
                  local_668._0_8_ = local_658;
                  local_668._8_8_ = (pointer)0x5;
                  local_658._0_6_ = 0x6e656b6f74;
                  if ((((GeomMesh *)local_4c8._8_8_ == (GeomMesh *)0x5) &&
                      (uVar13 = (uint)(*(byte *)(local_4c8._0_8_ + 4) ^ 0x6e) |
                                *(uint *)local_4c8._0_8_ ^ 0x656b6f74,
                      prop_name = (uint *)(ulong)uVar13, uVar13 == 0)) &&
                     (uVar13 = *(uint *)((long)&p_Var11[0x17]._M_parent + 4), uVar13 < 2)) {
                    if ((uint *)local_4c8._0_8_ != puVar1) {
                      operator_delete((void *)local_4c8._0_8_,
                                      CONCAT17(local_4c8[0x17],
                                               CONCAT16(local_4c8[0x16],
                                                        CONCAT15(local_4c8[0x15],
                                                                 CONCAT14(local_4c8[0x14],
                                                                          CONCAT13(local_4c8[0x13],
                                                                                   CONCAT12(
                                                  local_4c8[0x12],local_4c8._16_2_)))))) + 1);
                    }
                    if (uVar13 == 0) {
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4c8);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_4c8,"[warn]",6);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_4c8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                 ,0x5a);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_4c8,":",1);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_4c8,"ReconstructPrim",0xf);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_4c8,"():",3);
                      poVar8 = (ostream *)::std::ostream::operator<<((Property *)local_4c8,0xe7f);
                      ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_4c8,"No value assigned to `",0x16);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_4c8,"interpolateBoundary",0x13);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_4c8,"` token attribute. Set default token value.",
                                 0x2b);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_4c8,"\n",1);
                      if (local_6b8 != (string *)0x0) {
                        ::std::__cxx11::stringbuf::str();
                        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_668,
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_708,
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_6e8);
                        ::std::__cxx11::string::operator=((string *)local_6b8,(string *)local_668);
                        if ((GeomMesh *)local_668._0_8_ != (GeomMesh *)local_658) {
                          operator_delete((void *)local_668._0_8_,(ulong)(local_658._0_8_ + 1));
                        }
                        if ((GeomMesh *)local_708._0_8_ != (GeomMesh *)(local_708 + 0x10)) {
                          operator_delete((void *)local_708._0_8_,(ulong)(local_708._16_8_ + 1));
                        }
                      }
                      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4c8);
                      ::std::ios_base::~ios_base((ios_base *)(local_4c8 + 0x70));
                      AttrMetas::operator=
                                ((AttrMetas *)local_5f8._280_8_,(AttrMetas *)(p_Var11 + 7));
                      pcVar16 = "interpolateBoundary";
                      pcVar15 = "";
                      goto LAB_002268d7;
                    }
                  }
                  else if ((uint *)local_4c8._0_8_ != puVar1) {
                    operator_delete((void *)local_4c8._0_8_,
                                    CONCAT17(local_4c8[0x17],
                                             CONCAT16(local_4c8[0x16],
                                                      CONCAT15(local_4c8[0x15],
                                                               CONCAT14(local_4c8[0x14],
                                                                        CONCAT13(local_4c8[0x13],
                                                                                 CONCAT12(local_4c8[
                                                  0x12],local_4c8._16_2_)))))) + 1);
                  }
                }
                local_4c8._0_8_ = (uint *)0x0;
                local_4c8._8_8_ = (GeomMesh *)0x0;
                local_4c8[0x18] = '\n';
                local_4c8._25_2_ = 0x25aa;
                local_4c8[0x1b] = '\0';
                local_4c8[0x1c] = '\0';
                local_4c8[0x1d] = '\0';
                local_4c8._30_2_ = 0;
                local_4c8._16_2_ = 0xb44c;
                local_4c8[0x12] = '%';
                local_4c8[0x13] = '\0';
                local_4c8[0x14] = '\0';
                local_4c8[0x15] = '\0';
                local_4c8[0x16] = '\0';
                local_4c8[0x17] = '\0';
                local_668._0_8_ = local_658;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_668,"interpolateBoundary","");
                bVar5 = options->strict_allowedToken_check;
                local_1f8._16_8_ = (code *)0x0;
                local_1f8._24_8_ = 0;
                local_1f8._0_8_ = (void *)0x0;
                local_1f8._8_8_ = (pointer)0x0;
                pcVar3 = (code *)CONCAT17(local_4c8[0x17],
                                          CONCAT16(local_4c8[0x16],
                                                   CONCAT15(local_4c8[0x15],
                                                            CONCAT14(local_4c8[0x14],
                                                                     CONCAT13(local_4c8[0x13],
                                                                              CONCAT12(local_4c8[
                                                  0x12],local_4c8._16_2_))))));
                if (pcVar3 != (code *)0x0) {
                  (*pcVar3)(local_1f8,(Property *)local_4c8,2);
                  local_1f8._16_8_ =
                       CONCAT17(local_4c8[0x17],
                                CONCAT16(local_4c8[0x16],
                                         CONCAT15(local_4c8[0x15],
                                                  CONCAT14(local_4c8[0x14],
                                                           CONCAT13(local_4c8[0x13],
                                                                    CONCAT12(local_4c8[0x12],
                                                                             local_4c8._16_2_))))));
                  local_1f8._24_8_ =
                       CONCAT26(local_4c8._30_2_,
                                CONCAT15(local_4c8[0x1d],
                                         CONCAT14(local_4c8[0x1c],
                                                  CONCAT13(local_4c8[0x1b],
                                                           CONCAT21(local_4c8._25_2_,local_4c8[0x18]
                                                                   )))));
                }
                prop_name = (uint *)local_6c0;
                pTVar19 = local_6e8;
                bVar5 = ParseTimeSampledEnumProperty<tinyusdz::GeomMesh::InterpolateBoundary,tinyusdz::GeomMesh::InterpolateBoundary>
                                  ((string *)local_668,bVar5,
                                   (EnumHandlerFun<tinyusdz::GeomMesh::InterpolateBoundary> *)
                                   local_1f8,(Attribute *)local_6c0,
                                   (TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::GeomMesh::InterpolateBoundary>_>
                                    *)local_5f8._280_8_,local_6b8,(string *)local_6e8);
                if ((code *)local_1f8._16_8_ != (code *)0x0) {
                  (*(code *)local_1f8._16_8_)(local_1f8,local_1f8,3);
                }
                if ((GeomMesh *)local_668._0_8_ != (GeomMesh *)local_658) {
                  operator_delete((void *)local_668._0_8_,(ulong)(local_658._0_8_ + 1));
                }
                iVar7 = 1;
                if (!bVar5) goto LAB_002270ed;
                AttrMetas::operator=((AttrMetas *)local_5f8._280_8_,(AttrMetas *)(p_Var11 + 7));
                pcVar16 = "interpolateBoundary";
                pcVar15 = "";
LAB_002270ba:
                local_668._0_8_ = (GeomMesh *)local_658;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_668,pcVar16,pcVar15);
                ::std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string>
                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)local_698,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_668);
                if ((GeomMesh *)local_668._0_8_ != (GeomMesh *)local_658) {
                  operator_delete((void *)local_668._0_8_,(ulong)(local_658._0_8_ + 1));
                }
                iVar7 = 3;
                goto LAB_002270ed;
              }
            }
            else {
              iVar7 = ::std::__cxx11::string::compare((char *)__v);
              if (iVar7 == 0) {
                local_4c8._0_8_ = puVar1;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_4c8,"facevaryingLinearInterpolation","");
                cVar10 = ::std::
                         _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_698,(key_type *)local_4c8);
                if ((uint *)local_4c8._0_8_ != puVar1) {
                  operator_delete((void *)local_4c8._0_8_,
                                  CONCAT17(local_4c8[0x17],
                                           CONCAT16(local_4c8[0x16],
                                                    CONCAT15(local_4c8[0x15],
                                                             CONCAT14(local_4c8[0x14],
                                                                      CONCAT13(local_4c8[0x13],
                                                                               CONCAT12(local_4c8[
                                                  0x12],local_4c8._16_2_)))))) + 1);
                }
                if (cVar10._M_node == (_Base_ptr)local_690) {
                  if (((ulong)p_Var11[0x17]._M_parent & 0xfffffffe00000000) != 0x200000000) {
                    Attribute::type_name_abi_cxx11_((string *)local_4c8,(Attribute *)local_6c0);
                    local_668._0_8_ = local_658;
                    local_668._8_8_ = (pointer)0x5;
                    local_658._0_6_ = 0x6e656b6f74;
                    if ((((GeomMesh *)local_4c8._8_8_ == (GeomMesh *)0x5) &&
                        (uVar13 = (uint)(*(byte *)(local_4c8._0_8_ + 4) ^ 0x6e) |
                                  *(uint *)local_4c8._0_8_ ^ 0x656b6f74,
                        prop_name = (uint *)(ulong)uVar13, uVar13 == 0)) &&
                       (uVar13 = *(uint *)((long)&p_Var11[0x17]._M_parent + 4), uVar13 < 2)) {
                      if ((uint *)local_4c8._0_8_ != puVar1) {
                        operator_delete((void *)local_4c8._0_8_,
                                        CONCAT17(local_4c8[0x17],
                                                 CONCAT16(local_4c8[0x16],
                                                          CONCAT15(local_4c8[0x15],
                                                                   CONCAT14(local_4c8[0x14],
                                                                            CONCAT13(local_4c8[0x13]
                                                                                     ,CONCAT12(
                                                  local_4c8[0x12],local_4c8._16_2_)))))) + 1);
                      }
                      if (uVar13 == 0) {
                        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4c8);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_4c8,"[warn]",6);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_4c8,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                   ,0x5a);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_4c8,":",1);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_4c8,"ReconstructPrim",0xf);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_4c8,"():",3);
                        poVar8 = (ostream *)::std::ostream::operator<<((Property *)local_4c8,0xe82);
                        ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_4c8,"No value assigned to `",0x16);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_4c8,"facevaryingLinearInterpolation",0x1e);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_4c8,
                                   "` token attribute. Set default token value.",0x2b);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_4c8,"\n",1);
                        if (local_6b8 != (string *)0x0) {
                          ::std::__cxx11::stringbuf::str();
                          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)local_668,
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)local_708,
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)local_6e8);
                          ::std::__cxx11::string::operator=((string *)local_6b8,(string *)local_668)
                          ;
                          if ((GeomMesh *)local_668._0_8_ != (GeomMesh *)local_658) {
                            operator_delete((void *)local_668._0_8_,(ulong)(local_658._0_8_ + 1));
                          }
                          if ((GeomMesh *)local_708._0_8_ != (GeomMesh *)(local_708 + 0x10)) {
                            operator_delete((void *)local_708._0_8_,(ulong)(local_708._16_8_ + 1));
                          }
                        }
                        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4c8);
                        ::std::ios_base::~ios_base((ios_base *)(local_4c8 + 0x70));
                        AttrMetas::operator=
                                  ((AttrMetas *)local_5f8._272_8_,(AttrMetas *)(p_Var11 + 7));
                        pcVar16 = "facevaryingLinearInterpolation";
                        pcVar15 = "";
                        goto LAB_002268d7;
                      }
                    }
                    else if ((uint *)local_4c8._0_8_ != puVar1) {
                      operator_delete((void *)local_4c8._0_8_,
                                      CONCAT17(local_4c8[0x17],
                                               CONCAT16(local_4c8[0x16],
                                                        CONCAT15(local_4c8[0x15],
                                                                 CONCAT14(local_4c8[0x14],
                                                                          CONCAT13(local_4c8[0x13],
                                                                                   CONCAT12(
                                                  local_4c8[0x12],local_4c8._16_2_)))))) + 1);
                    }
                  }
                  local_4c8._0_8_ = (uint *)0x0;
                  local_4c8._8_8_ = (GeomMesh *)0x0;
                  local_4c8[0x18] = 'd';
                  local_4c8._25_2_ = 0x25b4;
                  local_4c8[0x1b] = '\0';
                  local_4c8[0x1c] = '\0';
                  local_4c8[0x1d] = '\0';
                  local_4c8._30_2_ = 0;
                  local_4c8._16_2_ = 0xbee4;
                  local_4c8[0x12] = '%';
                  local_4c8[0x13] = '\0';
                  local_4c8[0x14] = '\0';
                  local_4c8[0x15] = '\0';
                  local_4c8[0x16] = '\0';
                  local_4c8[0x17] = '\0';
                  local_668._0_8_ = local_658;
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_668,"facevaryingLinearInterpolation","");
                  bVar5 = options->strict_allowedToken_check;
                  local_208 = (code *)0x0;
                  auStack_200 = (undefined1  [8])0x0;
                  local_218._M_unused._M_object = (void *)0x0;
                  local_218._8_8_ = (pointer)0x0;
                  pcVar3 = (code *)CONCAT17(local_4c8[0x17],
                                            CONCAT16(local_4c8[0x16],
                                                     CONCAT15(local_4c8[0x15],
                                                              CONCAT14(local_4c8[0x14],
                                                                       CONCAT13(local_4c8[0x13],
                                                                                CONCAT12(local_4c8[
                                                  0x12],local_4c8._16_2_))))));
                  if (pcVar3 != (code *)0x0) {
                    (*pcVar3)(&local_218,(Property *)local_4c8,2);
                    local_208 = CONCAT17(local_4c8[0x17],
                                         CONCAT16(local_4c8[0x16],
                                                  CONCAT15(local_4c8[0x15],
                                                           CONCAT14(local_4c8[0x14],
                                                                    CONCAT13(local_4c8[0x13],
                                                                             CONCAT12(local_4c8[0x12
                                                  ],local_4c8._16_2_))))));
                    auStack_200 = (undefined1  [8])
                                  CONCAT26(local_4c8._30_2_,
                                           CONCAT15(local_4c8[0x1d],
                                                    CONCAT14(local_4c8[0x1c],
                                                             CONCAT13(local_4c8[0x1b],
                                                                      CONCAT21(local_4c8._25_2_,
                                                                               local_4c8[0x18])))));
                  }
                  prop_name = (uint *)local_6c0;
                  pTVar19 = local_6e8;
                  bVar5 = ParseTimeSampledEnumProperty<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation,tinyusdz::GeomMesh::FaceVaryingLinearInterpolation>
                                    ((string *)local_668,bVar5,
                                     (EnumHandlerFun<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation>
                                      *)&local_218,(Attribute *)local_6c0,
                                     (TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation>_>
                                      *)local_5f8._272_8_,local_6b8,(string *)local_6e8);
                  if ((code *)local_208 != (code *)0x0) {
                    (*(code *)local_208)(&local_218,&local_218,3);
                  }
                  if ((GeomMesh *)local_668._0_8_ != (GeomMesh *)local_658) {
                    operator_delete((void *)local_668._0_8_,(ulong)(local_658._0_8_ + 1));
                  }
                  iVar7 = 1;
                  if (bVar5) {
                    AttrMetas::operator=((AttrMetas *)local_5f8._272_8_,(AttrMetas *)(p_Var11 + 7));
                    pcVar16 = "facevaryingLinearInterpolation";
                    pcVar15 = "";
                    goto LAB_002270ba;
                  }
                  goto LAB_002270ed;
                }
              }
              else {
                local_190._0_8_ = &local_180;
                ::std::__cxx11::string::_M_construct<char*>
                          (local_190,*(long *)(p_Var11 + 1),
                           (long)&(p_Var11[1]._M_parent)->_M_color + *(long *)(p_Var11 + 1));
                local_4c8._0_8_ = puVar1;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_4c8,"skel:blendShapes","");
                prop_name = (uint *)local_6c0;
                pPVar17 = (Property *)local_4c8;
                (anonymous_namespace)::
                ParseTypedAttribute<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>
                          ((ParseResult *)local_668,(_anonymous_namespace_ *)local_698,
                           (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_190,(string *)local_6c0,(Property *)local_4c8,
                           (string *)local_288[0]._8_8_,
                           (TypedAttribute<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>
                            *)pTVar19);
                if ((uint *)local_4c8._0_8_ != puVar1) {
                  operator_delete((void *)local_4c8._0_8_,
                                  CONCAT17(local_4c8[0x17],
                                           CONCAT16(local_4c8[0x16],
                                                    CONCAT15(local_4c8[0x15],
                                                             CONCAT14(local_4c8[0x14],
                                                                      CONCAT13(local_4c8[0x13],
                                                                               CONCAT12(local_4c8[
                                                  0x12],local_4c8._16_2_)))))) + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_190._0_8_ != &local_180) {
                  operator_delete((void *)local_190._0_8_,local_180._M_allocated_capacity + 1);
                }
                iVar7 = 0;
                if ((local_668._0_8_ & 0xfffffffd) == 0) {
                  iVar7 = 3;
LAB_0022691c:
                  bVar5 = false;
                }
                else {
                  bVar5 = true;
                  if (local_668._0_4_ != Unmatched) {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4c8);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_4c8,"[error]",7);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_4c8,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                               ,0x5a);
                    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,":",1)
                    ;
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_4c8,"ReconstructPrim",0xf);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_4c8,"():",3);
                    poVar8 = (ostream *)::std::ostream::operator<<((Property *)local_4c8,0xe84);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
                    local_6e0._M_dataplus._M_p = (pointer)&local_6e0.field_2;
                    ::std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_6e0,"Parsing attribute `{}` failed. Error: {}","");
                    prop_name = (uint *)(local_668 + 8);
                    fmt::format<char_const*,std::__cxx11::string>
                              ((string *)local_708,(fmt *)&local_6e0,(string *)&kSkelBlendShapes,
                               (char **)prop_name,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               pPVar17);
                    poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                                       ((ostream *)local_4c8,(char *)local_708._0_8_,local_708._8_8_
                                       );
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
                    if ((GeomMesh *)local_708._0_8_ != (GeomMesh *)(local_708 + 0x10)) {
                      operator_delete((void *)local_708._0_8_,(ulong)(local_708._16_8_ + 1));
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e0._M_dataplus._M_p != &local_6e0.field_2) {
                      operator_delete(local_6e0._M_dataplus._M_p,
                                      (ulong)(local_6e0.field_2._M_allocated_capacity + 1));
                    }
                    if (local_6e8 !=
                        (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
                         *)0x0) {
                      ::std::__cxx11::stringbuf::str();
                      pTVar4 = local_6e8;
                      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_708,&local_6e0,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_6e8);
                      ::std::__cxx11::string::operator=((string *)pTVar4,(string *)local_708);
                      if ((GeomMesh *)local_708._0_8_ != (GeomMesh *)(local_708 + 0x10)) {
                        operator_delete((void *)local_708._0_8_,(ulong)(local_708._16_8_ + 1));
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_6e0._M_dataplus._M_p != &local_6e0.field_2) {
                        operator_delete(local_6e0._M_dataplus._M_p,
                                        (ulong)(local_6e0.field_2._M_allocated_capacity + 1));
                      }
                    }
                    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4c8);
                    ::std::ios_base::~ios_base((ios_base *)(local_4c8 + 0x70));
                    iVar7 = 1;
                    goto LAB_0022691c;
                  }
                }
                if ((undefined1 *)local_668._8_8_ != local_658 + 8) {
                  operator_delete((void *)local_668._8_8_,(ulong)(local_658._8_8_ + 1));
                }
                if (!bVar5) goto LAB_00227107;
                local_4c8._16_2_ = 0x7573;
                local_4c8[0x12] = 'b';
                local_4c8[0x13] = 's';
                local_4c8[0x14] = 'e';
                local_4c8[0x15] = 't';
                local_4c8[0x16] = 'F';
                local_4c8[0x17] = 'a';
                local_4c8[0x18] = 'm';
                local_4c8._25_2_ = 0x6c69;
                local_4c8[0x1b] = 'y';
                local_4c8._8_8_ = (GeomMesh *)0xc;
                local_4c8[0x1c] = '\0';
                local_4c8._0_8_ = puVar1;
                if (((_Base_ptr)0xb < p_Var11[1]._M_parent) &&
                   (prop_name = (uint *)(**(ulong **)__v ^ 0x6146746573627573),
                   (int)(*(ulong **)__v)[1] == 0x796c696d &&
                   (GeomMesh *)prop_name == (GeomMesh *)0x0)) {
                  local_4c8._16_2_ = 0x3a;
                  local_4c8._8_8_ = (GeomMesh *)0x1;
                  prop_name = (uint *)0x147ae14;
                  split(&local_6b0,(string *)__v,(string *)local_4c8,0x147ae14);
                  if ((uint *)local_4c8._0_8_ != puVar1) {
                    operator_delete((void *)local_4c8._0_8_,
                                    CONCAT17(local_4c8[0x17],
                                             CONCAT16(local_4c8[0x16],
                                                      CONCAT15(local_4c8[0x15],
                                                               CONCAT14(local_4c8[0x14],
                                                                        CONCAT13(local_4c8[0x13],
                                                                                 CONCAT12(local_4c8[
                                                  0x12],local_4c8._16_2_)))))) + 1);
                  }
                  if ((((long)local_6b0.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_6b0.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start == 0x60) &&
                      (iVar7 = ::std::__cxx11::string::compare
                                         ((char *)local_6b0.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start),
                      iVar7 == 0)) &&
                     (iVar7 = ::std::__cxx11::string::compare
                                        ((char *)(local_6b0.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + 2)),
                     iVar7 == 0)) {
                    prop_name = (uint *)0x0;
                    local_4c8._0_8_ = ((ulong)local_4c8._0_8_ >> 8 & 0xffffff) << 8;
                    local_4c8._8_8_ = ((ulong)local_4c8._8_8_ >> 8 & 0xffffff) << 8;
                    local_4c8._16_2_ = 0;
                    local_4c8[0x18] = '\0';
                    local_4c8._144_8_ = (pointer)0x0;
                    local_4c8[0x98] = 0;
                    local_318 = 0;
                    sStack_310.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
                    sStack_338._16_8_ = 0;
                    sStack_338._24_8_ = 0;
                    sStack_310._16_4_ = 0;
                    sStack_310._24_8_ = 0;
                    local_4c8[0x50] = 0;
                    local_4c8._64_8_ = 0;
                    local_4c8._72_8_ = (void *)0x0;
                    local_4c8._48_8_ = 0;
                    local_4c8._56_8_ = 0;
                    local_4c8._32_4_ = Varying;
                    local_4c8[0x24] = false;
                    local_4c8._37_3_ = 0;
                    local_4c8._40_8_ = (pointer)0x0;
                    local_4c8[0x88] = 0;
                    local_4c8._120_8_ = (pointer)0x0;
                    local_4c8._128_8_ = 0;
                    local_4c8._104_8_ = (pointer)0x0;
                    local_4c8._112_8_ = (pointer)0x0;
                    local_4c8._88_8_ = (vtable_type *)0x0;
                    local_4c8._96_8_ = 0;
                    local_408._0_1_ = 0;
                    local_4c8._176_8_ = 0;
                    local_4c8._184_8_ = 0;
                    local_4c8[0xa0] = false;
                    local_4c8._161_3_ = 0;
                    local_4c8._164_4_ = (storage_t<tinyusdz::Interpolation>)0x0;
                    local_4c8[0xa8] = false;
                    local_4c8._169_3_ = 0;
                    local_4c8._172_4_ = (storage_t<unsigned_int>)0x0;
                    local_408._40_1_ = 0;
                    local_408._24_8_ = 0;
                    local_408._32_8_ = 0;
                    local_408._8_8_ = 0;
                    local_408._16_8_ = 0;
                    sStack_3d0._24_1_ = 0;
                    sStack_3d0._8_8_ = 0;
                    sStack_3d0._16_8_ = 0;
                    local_3d8 = 0;
                    sStack_3d0.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
                    sStack_388._8_1_ = 0;
                    local_390 = 0;
                    sStack_388.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
                    local_3a0 = 0;
                    uStack_398 = (storage_t<double>)0x0;
                    sStack_3d0._32_8_ = 0;
                    sStack_3d0._40_8_ = 0;
                    sStack_360._8_1_ = 0;
                    local_368 = 0;
                    sStack_360.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
                    sStack_388._16_8_ = 0;
                    sStack_388._24_8_ = 0;
                    sStack_338._8_1_ = 0;
                    local_340 = 0;
                    sStack_338.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
                    sStack_360._16_8_ = 0;
                    sStack_360._24_8_ = 0;
                    sStack_310._32_8_ = (long)&sStack_310 + 0x10;
                    auStack_2b0._12_4_ = 0;
                    auStack_2b0[0x10] = 0;
                    auStack_2b0[0] = 0;
                    auStack_2b0._1_8_ = 0;
                    auStack_2d8._24_8_ = 0;
                    auStack_2d8[0x20] = false;
                    auStack_2d8._33_7_ = 0;
                    auStack_2d8._8_8_ = 0;
                    auStack_2d8._16_8_ = 0;
                    local_2e0 = 0;
                    auStack_2d8._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
                    auStack_2b0._20_4_ = 2;
                    auStack_2b0[0x18] = 0;
                    sStack_310._40_8_ = sStack_310._32_8_;
                    _Var6 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)__v,(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)__v);
                    if (_Var6) {
                      cVar10 = ::std::
                               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)local_698,(key_type *)__v);
                      iVar7 = 3;
                      prop_name = (uint *)local_690;
                      if (cVar10._M_node == (_Base_ptr)prop_name) {
                        if (((ulong)p_Var11[0x17]._M_parent & 0xfffffffe00000000) != 0x200000000) {
                          Attribute::type_name_abi_cxx11_
                                    ((string *)local_668,(Attribute *)local_6c0);
                          local_708._0_8_ = local_708 + 0x10;
                          local_708._8_8_ = (GeomMesh *)0x5;
                          local_708._16_6_ = 0x6e656b6f74;
                          if ((((pointer)local_668._8_8_ == (pointer)0x5) &&
                              (uVar13 = (uint)(*(byte *)(local_668._0_8_ + 4) ^ 0x6e) |
                                        *(uint *)local_668._0_8_ ^ 0x656b6f74,
                              prop_name = (uint *)(ulong)uVar13, uVar13 == 0)) &&
                             (uVar13 = *(uint *)((long)&p_Var11[0x17]._M_parent + 4), uVar13 < 2)) {
                            if ((GeomMesh *)local_668._0_8_ != (GeomMesh *)local_658) {
                              operator_delete((void *)local_668._0_8_,(ulong)(local_658._0_8_ + 1));
                            }
                            if (uVar13 == 0) {
                              ::std::__cxx11::ostringstream::ostringstream
                                        ((ostringstream *)local_668);
                              ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_668,"[warn]",6);
                              ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_668,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                         ,0x5a);
                              ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_668,":",1);
                              ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_668,"ReconstructPrim",0xf);
                              ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_668,"():",3);
                              poVar8 = (ostream *)
                                       ::std::ostream::operator<<((ostringstream *)local_668,0xe94);
                              ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
                              ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_668,"No value assigned to `",0x16);
                              poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                                                 ((ostream *)local_668,*(char **)(p_Var11 + 1),
                                                  (long)p_Var11[1]._M_parent);
                              ::std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar8,"` token attribute. Set default token value.",0x2b);
                              ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
                              if (local_6b8 != (string *)0x0) {
                                ::std::__cxx11::stringbuf::str();
                                ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_708,&local_6e0,
                                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_6e8);
                                ::std::__cxx11::string::operator=
                                          ((string *)local_6b8,(string *)local_708);
                                if ((GeomMesh *)local_708._0_8_ != (GeomMesh *)(local_708 + 0x10)) {
                                  operator_delete((void *)local_708._0_8_,
                                                  (ulong)(local_708._16_8_ + 1));
                                }
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_6e0._M_dataplus._M_p != &local_6e0.field_2) {
                                  operator_delete(local_6e0._M_dataplus._M_p,
                                                  (ulong)(local_6e0.field_2._M_allocated_capacity +
                                                         1));
                                }
                              }
                              ::std::__cxx11::ostringstream::~ostringstream
                                        ((ostringstream *)local_668);
                              ::std::ios_base::~ios_base(local_5f8);
                              AttrMetas::operator=
                                        ((AttrMetas *)local_4c8,(AttrMetas *)(p_Var11 + 7));
                              ::std::
                              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                              ::_M_insert_unique<std::__cxx11::string_const&>
                                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                          *)local_698,
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)__v);
                              goto LAB_002275d5;
                            }
                          }
                          else if ((GeomMesh *)local_668._0_8_ != (GeomMesh *)local_658) {
                            operator_delete((void *)local_668._0_8_,(ulong)(local_658._0_8_ + 1));
                          }
                        }
                        local_668._0_8_ = (GeomMesh *)0x0;
                        local_668._8_8_ = (pointer)0x0;
                        local_658._8_8_ =
                             ::std::
                             _Function_handler<nonstd::expected_lite::expected<tinyusdz::GeomSubset::FamilyType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc:3666:28)>
                             ::_M_invoke;
                        local_658._0_8_ =
                             ::std::
                             _Function_handler<nonstd::expected_lite::expected<tinyusdz::GeomSubset::FamilyType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc:3666:28)>
                             ::_M_manager;
                        local_1b8.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
                        local_1b8.super__Function_base._M_functor._8_8_ = (pointer)0x0;
                        local_1b8._M_invoker =
                             ::std::
                             _Function_handler<nonstd::expected_lite::expected<tinyusdz::GeomSubset::FamilyType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc:3666:28)>
                             ::_M_invoke;
                        local_1b8.super__Function_base._M_manager =
                             ::std::
                             _Function_handler<nonstd::expected_lite::expected<tinyusdz::GeomSubset::FamilyType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc:3666:28)>
                             ::_M_manager;
                        prop_name = (uint *)local_6c0;
                        pTVar19 = local_6e8;
                        bVar5 = ParseUniformEnumProperty<tinyusdz::GeomSubset::FamilyType,tinyusdz::GeomSubset::FamilyType>
                                          ((string *)__v,options->strict_allowedToken_check,
                                           &local_1b8,(Attribute *)local_6c0,
                                           (TypedAttributeWithFallback<tinyusdz::GeomSubset::FamilyType>
                                            *)local_4c8,local_6b8,(string *)local_6e8);
                        if (local_1b8.super__Function_base._M_manager != (code *)0x0) {
                          (*local_1b8.super__Function_base._M_manager)(&local_1b8,&local_1b8,3);
                        }
                        iVar7 = 1;
                        if (bVar5) {
                          AttrMetas::operator=((AttrMetas *)local_4c8,(AttrMetas *)(p_Var11 + 7));
                          ::std::
                          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          ::_M_insert_unique<std::__cxx11::string_const&>
                                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                      *)local_698,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)__v);
                          iVar7 = 3;
                        }
                        if ((pointer)local_658._0_8_ != (pointer)0x0) {
                          (*(code *)local_658._0_8_)(local_668,local_668,3);
                        }
                      }
                    }
                    else {
                      mVar2 = *(mapped_type *)
                               (auStack_2b0 + (ulong)((byte)auStack_2b0[8] ^ 1) * 8 + 0xc);
                      local_668._0_8_ = local_658;
                      local_668._8_8_ = (pointer)0x0;
                      local_658._0_8_ = local_658._0_8_ & 0xffffffffffffff00;
                      ::std::__cxx11::string::_M_assign((string *)local_668);
                      pmVar12 = ::std::
                                map<tinyusdz::Token,_tinyusdz::GeomSubset::FamilyType,_std::less<tinyusdz::Token>,_std::allocator<std::pair<const_tinyusdz::Token,_tinyusdz::GeomSubset::FamilyType>_>_>
                                ::operator[]((map<tinyusdz::Token,_tinyusdz::GeomSubset::FamilyType,_std::less<tinyusdz::Token>,_std::allocator<std::pair<const_tinyusdz::Token,_tinyusdz::GeomSubset::FamilyType>_>_>
                                              *)auStack_2b0._32_8_,(key_type *)local_668);
                      *pmVar12 = mVar2;
                      if ((GeomMesh *)local_668._0_8_ != (GeomMesh *)local_658) {
                        operator_delete((void *)local_668._0_8_,(ulong)(local_658._0_8_ + 1));
                      }
                      iVar7 = 0;
                    }
LAB_002275d5:
                    ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
                              ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                               (auStack_2d8 + 0x18));
                    AttrMetas::~AttrMetas((AttrMetas *)local_4c8);
                    if (iVar7 != 0) {
                      ::std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::~vector(&local_6b0);
                      goto LAB_00227107;
                    }
                  }
                  ::std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector(&local_6b0);
                }
                cVar10 = ::std::
                         _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_698,(key_type *)__v);
                if (cVar10._M_node == (_Base_ptr)local_690) {
                  this = ::std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                                       *)local_288[0]._0_8_,(key_type *)__v);
                  Property::operator=(this,(Property *)local_6c0);
                  ::std::
                  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  ::_M_insert_unique<std::__cxx11::string_const&>
                            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                              *)local_698,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             __v);
                }
                cVar10 = ::std::
                         _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_698,(key_type *)__v);
                if (cVar10._M_node == (_Base_ptr)local_690) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4c8);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_4c8,"[warn]",6);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_4c8,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                             ,0x5a);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_4c8,"ReconstructPrim",0xf);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,"():",3)
                  ;
                  poVar8 = (ostream *)::std::ostream::operator<<((Property *)local_4c8,0xea0);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
                  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_668,"Unsupported/unimplemented property: ",
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)__v);
                  poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                                     ((ostream *)local_4c8,(char *)local_668._0_8_,local_668._8_8_);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
                  if ((GeomMesh *)local_668._0_8_ != (GeomMesh *)local_658) {
                    operator_delete((void *)local_668._0_8_,(ulong)(local_658._0_8_ + 1));
                  }
                  if (local_6b8 != (string *)0x0) {
                    ::std::__cxx11::stringbuf::str();
                    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_668,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_708,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_6e8);
                    ::std::__cxx11::string::operator=((string *)local_6b8,(string *)local_668);
                    if ((GeomMesh *)local_668._0_8_ != (GeomMesh *)local_658) {
                      operator_delete((void *)local_668._0_8_,(ulong)(local_658._0_8_ + 1));
                    }
                    if ((GeomMesh *)local_708._0_8_ != (GeomMesh *)(local_708 + 0x10)) {
                      operator_delete((void *)local_708._0_8_,(ulong)(local_708._16_8_ + 1));
                    }
                  }
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4c8);
                  ::std::ios_base::~ios_base((ios_base *)(local_4c8 + 0x70));
                }
              }
            }
          }
        }
        else {
LAB_00227107:
          if ((iVar7 != 3) && (iVar7 != 0)) goto LAB_00227bd1;
        }
LAB_00227116:
        p_Var11 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var11);
      } while (p_Var11 != (_Base_ptr)local_220);
      bVar18 = true;
    }
  }
LAB_00227bd4:
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_698,(_Link_type)local_690._8_8_);
  return bVar18;
}

Assistant:

bool ReconstructPrim<GeomMesh>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    GeomMesh *mesh,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options) {

  (void)references;
  (void)options;

  DCOUT("GeomMesh");

  auto SubdivisionSchemeHandler = [](const std::string &tok)
      -> nonstd::expected<GeomMesh::SubdivisionScheme, std::string> {
    using EnumTy = std::pair<GeomMesh::SubdivisionScheme, const char *>;
    const std::vector<EnumTy> enums = {
        std::make_pair(GeomMesh::SubdivisionScheme::SubdivisionSchemeNone, "none"),
        std::make_pair(GeomMesh::SubdivisionScheme::CatmullClark,
                       "catmullClark"),
        std::make_pair(GeomMesh::SubdivisionScheme::Loop, "loop"),
        std::make_pair(GeomMesh::SubdivisionScheme::Bilinear, "bilinear"),
    };
    return EnumHandler<GeomMesh::SubdivisionScheme>("subdivisionScheme", tok,
                                                    enums);
  };

  auto InterpolateBoundaryHandler = [](const std::string &tok)
      -> nonstd::expected<GeomMesh::InterpolateBoundary, std::string> {
    using EnumTy = std::pair<GeomMesh::InterpolateBoundary, const char *>;
    const std::vector<EnumTy> enums = {
        std::make_pair(GeomMesh::InterpolateBoundary::InterpolateBoundaryNone, "none"),
        std::make_pair(GeomMesh::InterpolateBoundary::EdgeAndCorner,
                       "edgeAndCorner"),
        std::make_pair(GeomMesh::InterpolateBoundary::EdgeOnly, "edgeOnly"),
    };
    return EnumHandler<GeomMesh::InterpolateBoundary>("interpolateBoundary",
                                                      tok, enums);
  };

  auto FaceVaryingLinearInterpolationHandler = [](const std::string &tok)
      -> nonstd::expected<GeomMesh::FaceVaryingLinearInterpolation,
                          std::string> {
    using EnumTy =
        std::pair<GeomMesh::FaceVaryingLinearInterpolation, const char *>;
    const std::vector<EnumTy> enums = {
        std::make_pair(GeomMesh::FaceVaryingLinearInterpolation::CornersPlus1,
                       "cornersPlus1"),
        std::make_pair(GeomMesh::FaceVaryingLinearInterpolation::CornersPlus2,
                       "cornersPlus2"),
        std::make_pair(GeomMesh::FaceVaryingLinearInterpolation::CornersOnly,
                       "cornersOnly"),
        std::make_pair(GeomMesh::FaceVaryingLinearInterpolation::Boundaries,
                       "boundaries"),
        std::make_pair(GeomMesh::FaceVaryingLinearInterpolation::FaceVaryingLinearInterpolationNone, "none"),
        std::make_pair(GeomMesh::FaceVaryingLinearInterpolation::All, "all"),
    };
    return EnumHandler<GeomMesh::FaceVaryingLinearInterpolation>(
        "facevaryingLinearInterpolation", tok, enums);
  };

  auto FamilyTypeHandler = [](const std::string &tok)
      -> nonstd::expected<GeomSubset::FamilyType, std::string> {
    using EnumTy = std::pair<GeomSubset::FamilyType, const char *>;
    const std::vector<EnumTy> enums = {
        std::make_pair(GeomSubset::FamilyType::Partition, "partition"),
        std::make_pair(GeomSubset::FamilyType::NonOverlapping, "nonOverlapping"),
        std::make_pair(GeomSubset::FamilyType::Unrestricted, "unrestricted"),
    };
    return EnumHandler<GeomSubset::FamilyType>("familyType", tok,
                                                    enums);
  };

  std::set<std::string> table;
  if (!ReconstructGPrimProperties(spec, table, properties, mesh, warn, err, options.strict_allowedToken_check)) {
    return false;
  }

  for (const auto &prop : properties) {
    DCOUT("GeomMesh prop: " << prop.first);
    PARSE_SINGLE_TARGET_PATH_RELATION(table, prop, kSkelSkeleton, mesh->skeleton)
    PARSE_TARGET_PATHS_RELATION(table, prop, kSkelBlendShapeTargets, mesh->blendShapeTargets)
    PARSE_TYPED_ATTRIBUTE(table, prop, "points", GeomMesh, mesh->points)
    PARSE_TYPED_ATTRIBUTE(table, prop, "normals", GeomMesh, mesh->normals)
    PARSE_TYPED_ATTRIBUTE(table, prop, "faceVertexCounts", GeomMesh,
                         mesh->faceVertexCounts)
    PARSE_TYPED_ATTRIBUTE(table, prop, "faceVertexIndices", GeomMesh,
                         mesh->faceVertexIndices)
    // Subd
    PARSE_TYPED_ATTRIBUTE(table, prop, "cornerIndices", GeomMesh,
                         mesh->cornerIndices)
    PARSE_TYPED_ATTRIBUTE(table, prop, "cornerSharpnesses", GeomMesh,
                         mesh->cornerSharpnesses)
    PARSE_TYPED_ATTRIBUTE(table, prop, "creaseIndices", GeomMesh,
                         mesh->creaseIndices)
    PARSE_TYPED_ATTRIBUTE(table, prop, "creaseLengths", GeomMesh,
                         mesh->creaseLengths)
    PARSE_TYPED_ATTRIBUTE(table, prop, "creaseSharpnesses", GeomMesh,
                         mesh->creaseSharpnesses)
    PARSE_TYPED_ATTRIBUTE(table, prop, "holeIndices", GeomMesh,
                         mesh->holeIndices)
    PARSE_UNIFORM_ENUM_PROPERTY(table, prop, "subdivisionScheme", GeomMesh::SubdivisionScheme,
                       SubdivisionSchemeHandler, GeomMesh,
                       mesh->subdivisionScheme, options.strict_allowedToken_check)
    PARSE_TIMESAMPLED_ENUM_PROPERTY(table, prop, "interpolateBoundary",
                       GeomMesh::InterpolateBoundary, InterpolateBoundaryHandler, GeomMesh,
                       mesh->interpolateBoundary, options.strict_allowedToken_check)
    PARSE_TIMESAMPLED_ENUM_PROPERTY(table, prop, "facevaryingLinearInterpolation",
                       GeomMesh::FaceVaryingLinearInterpolation, FaceVaryingLinearInterpolationHandler, GeomMesh,
                       mesh->faceVaryingLinearInterpolation, options.strict_allowedToken_check)
    // blendShape names
    PARSE_TYPED_ATTRIBUTE(table, prop, kSkelBlendShapes, GeomMesh, mesh->blendShapes)

    // subsetFamily for GeomSubset
    if (startsWith(prop.first, "subsetFamily")) {
      // uniform subsetFamily::<FAMILYNAME>:familyType = ...
      std::vector<std::string> names = split(prop.first, ":");

      if ((names.size() == 3) &&
          (names[0] == "subsetFamily") &&
          (names[2] == "familyType")) {

        DCOUT("subsetFamily" << prop.first);
        TypedAttributeWithFallback<GeomSubset::FamilyType> familyType{GeomSubset::FamilyType::Unrestricted};

        PARSE_UNIFORM_ENUM_PROPERTY(table, prop, prop.first,
                           GeomSubset::FamilyType, FamilyTypeHandler, GeomMesh,
                           familyType, options.strict_allowedToken_check)

        // NOTE: Ignore metadataum of familyType.
        
        // TODO: Validate familyName
        mesh->subsetFamilyTypeMap[value::token(names[1])] = familyType.get_value();

      }
    }

    // generic
    ADD_PROPERTY(table, prop, GeomMesh, mesh->props)
    PARSE_PROPERTY_END_MAKE_WARN(table, prop)
  }


  return true;
}